

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersector1<8,_16777232,_true,_embree::avx2::SubGridMBIntersector1Pluecker<8,_true>_>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ushort uVar14;
  ushort uVar15;
  Geometry *pGVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  RTCIntersectArguments *pRVar20;
  RTCRayQueryContext *pRVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  byte bVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  RayHit *pRVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  AABBNodeMB4D *node1;
  ulong uVar58;
  long lVar59;
  long lVar60;
  uint uVar61;
  ulong uVar63;
  undefined1 (*pauVar64) [16];
  long lVar65;
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  long lVar69;
  undefined1 (*pauVar70) [16];
  ulong uVar71;
  ulong uVar72;
  ulong uVar73;
  long lVar74;
  long lVar75;
  ulong uVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  float fVar89;
  undefined1 auVar85 [32];
  float fVar87;
  float fVar88;
  undefined1 auVar86 [64];
  undefined4 uVar90;
  undefined1 auVar93 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  float fVar98;
  float fVar104;
  float fVar105;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  float fVar106;
  undefined1 auVar103 [32];
  undefined8 uVar107;
  undefined1 auVar108 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  __m128 a;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [64];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [64];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [64];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [64];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  undefined1 auVar153 [64];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [64];
  float fVar165;
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar170 [64];
  float fVar177;
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  undefined1 auVar180 [64];
  undefined1 auVar187 [32];
  undefined1 auVar188 [64];
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  UVIdentity<8> mapUV;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vint8 bi;
  vbool<8> valid;
  vint8 bi_1;
  vfloat<8> tNear;
  vfloat<8> dist;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2a21;
  ulong local_2a20;
  RayQueryContext *local_2a18;
  uint local_2a0c;
  uint local_2a08;
  int local_2a04;
  undefined1 local_2a00 [16];
  ulong local_29f0;
  ulong local_29e8;
  undefined1 local_29e0 [32];
  undefined1 local_29c0 [32];
  long local_2990;
  long local_2988;
  ulong local_2980;
  ulong local_2978;
  ulong local_2970;
  ulong local_2968;
  ulong local_2960;
  RayHit *local_2958;
  undefined1 (*local_2950) [16];
  long local_2948;
  long local_2940;
  long local_2938;
  Scene *local_2930;
  ulong local_2928;
  RTCFilterFunctionNArguments local_2920;
  float local_28f0;
  float local_28ec;
  float local_28e8;
  undefined4 local_28e4;
  undefined4 local_28e0;
  undefined4 local_28dc;
  undefined4 local_28d8;
  uint local_28d4;
  uint local_28d0;
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  float local_2820;
  float fStack_281c;
  float fStack_2818;
  float fStack_2814;
  float fStack_2810;
  float fStack_280c;
  float fStack_2808;
  float fStack_2804;
  undefined1 local_2800 [32];
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2750 [16];
  undefined1 local_2740 [32];
  undefined1 local_2720 [8];
  float fStack_2718;
  float fStack_2714;
  float fStack_2710;
  float fStack_270c;
  float fStack_2708;
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [8];
  float fStack_2698;
  float fStack_2694;
  float fStack_2690;
  float fStack_268c;
  float fStack_2688;
  float fStack_2684;
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 *local_2640;
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  float local_25a0 [4];
  float fStack_2590;
  float fStack_258c;
  float fStack_2588;
  undefined4 uStack_2584;
  float local_2580 [4];
  float fStack_2570;
  float fStack_256c;
  float fStack_2568;
  undefined4 uStack_2564;
  float local_2560 [4];
  float fStack_2550;
  float fStack_254c;
  float fStack_2548;
  undefined4 uStack_2544;
  undefined1 local_2540 [8];
  float fStack_2538;
  float fStack_2534;
  float fStack_2530;
  float fStack_252c;
  float fStack_2528;
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  float local_2440;
  float fStack_243c;
  float fStack_2438;
  float fStack_2434;
  float fStack_2430;
  float fStack_242c;
  float fStack_2428;
  float fStack_2424;
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  ulong uVar62;
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 == 8) {
    return;
  }
  pauVar70 = (undefined1 (*) [16])local_2390;
  uStack_2398 = 0;
  aVar2 = (ray->super_RayK<1>).dir.field_0;
  auVar77 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
  fVar1 = (ray->super_RayK<1>).tfar;
  auVar91 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)fVar1));
  auVar99._8_4_ = 0x7fffffff;
  auVar99._0_8_ = 0x7fffffff7fffffff;
  auVar99._12_4_ = 0x7fffffff;
  auVar99 = vandps_avx((undefined1  [16])aVar2,auVar99);
  auVar121._8_4_ = 0x219392ef;
  auVar121._0_8_ = 0x219392ef219392ef;
  auVar121._12_4_ = 0x219392ef;
  auVar99 = vcmpps_avx(auVar99,auVar121,1);
  auVar122._8_4_ = 0x3f800000;
  auVar122._0_8_ = 0x3f8000003f800000;
  auVar122._12_4_ = 0x3f800000;
  auVar121 = vdivps_avx(auVar122,(undefined1  [16])aVar2);
  auVar123._8_4_ = 0x5d5e0b6b;
  auVar123._0_8_ = 0x5d5e0b6b5d5e0b6b;
  auVar123._12_4_ = 0x5d5e0b6b;
  auVar99 = vblendvps_avx(auVar121,auVar123,auVar99);
  auVar111._0_4_ = auVar99._0_4_ * 0.99999964;
  auVar111._4_4_ = auVar99._4_4_ * 0.99999964;
  auVar111._8_4_ = auVar99._8_4_ * 0.99999964;
  auVar111._12_4_ = auVar99._12_4_ * 0.99999964;
  auVar108._0_4_ = auVar99._0_4_ * 1.0000004;
  auVar108._4_4_ = auVar99._4_4_ * 1.0000004;
  auVar108._8_4_ = auVar99._8_4_ * 1.0000004;
  auVar108._12_4_ = auVar99._12_4_ * 1.0000004;
  uVar90 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
  local_26e0._4_4_ = uVar90;
  local_26e0._0_4_ = uVar90;
  local_26e0._8_4_ = uVar90;
  local_26e0._12_4_ = uVar90;
  local_26e0._16_4_ = uVar90;
  local_26e0._20_4_ = uVar90;
  local_26e0._24_4_ = uVar90;
  local_26e0._28_4_ = uVar90;
  uVar90 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
  local_2700._4_4_ = uVar90;
  local_2700._0_4_ = uVar90;
  local_2700._8_4_ = uVar90;
  local_2700._12_4_ = uVar90;
  local_2700._16_4_ = uVar90;
  local_2700._20_4_ = uVar90;
  local_2700._24_4_ = uVar90;
  local_2700._28_4_ = uVar90;
  local_2720._4_4_ = auVar111._0_4_;
  local_2720._0_4_ = auVar111._0_4_;
  fStack_2718 = auVar111._0_4_;
  fStack_2714 = auVar111._0_4_;
  fStack_2710 = auVar111._0_4_;
  fStack_270c = auVar111._0_4_;
  fStack_2708 = auVar111._0_4_;
  register0x0000149c = auVar111._0_4_;
  auVar99 = vmovshdup_avx(auVar111);
  uVar107 = auVar99._0_8_;
  local_27e0._8_8_ = uVar107;
  local_27e0._0_8_ = uVar107;
  local_27e0._16_8_ = uVar107;
  local_27e0._24_8_ = uVar107;
  auVar170 = ZEXT3264(local_27e0);
  auVar122 = vshufpd_avx(auVar111,auVar111,1);
  auVar121 = vshufps_avx(auVar111,auVar111,0xaa);
  uVar107 = auVar121._0_8_;
  local_2800._8_8_ = uVar107;
  local_2800._0_8_ = uVar107;
  local_2800._16_8_ = uVar107;
  local_2800._24_8_ = uVar107;
  auVar180 = ZEXT3264(local_2800);
  auVar121 = vmovshdup_avx(auVar108);
  uVar107 = auVar121._0_8_;
  local_2840._8_8_ = uVar107;
  local_2840._0_8_ = uVar107;
  local_2840._16_8_ = uVar107;
  local_2840._24_8_ = uVar107;
  auVar188 = ZEXT3264(local_2840);
  auVar121 = vshufps_avx(auVar108,auVar108,0xaa);
  uVar67 = (ulong)(auVar111._0_4_ < 0.0) << 5;
  auVar131 = ZEXT3264(_local_2720);
  uVar71 = (ulong)(auVar99._0_4_ < 0.0) << 5 | 0x40;
  auVar144 = ZEXT3264(local_2700);
  auVar136 = ZEXT3264(local_26e0);
  uVar107 = auVar121._0_8_;
  local_2860._8_8_ = uVar107;
  local_2860._0_8_ = uVar107;
  local_2860._16_8_ = uVar107;
  local_2860._24_8_ = uVar107;
  auVar153 = ZEXT3264(local_2860);
  uVar72 = (ulong)(auVar122._0_4_ < 0.0) << 5 | 0x80;
  uVar68 = uVar67 ^ 0x20;
  uVar76 = uVar71 ^ 0x20;
  uVar73 = uVar72 ^ 0x20;
  uVar90 = auVar77._0_4_;
  local_2880._4_4_ = uVar90;
  local_2880._0_4_ = uVar90;
  local_2880._8_4_ = uVar90;
  local_2880._12_4_ = uVar90;
  local_2880._16_4_ = uVar90;
  local_2880._20_4_ = uVar90;
  local_2880._24_4_ = uVar90;
  local_2880._28_4_ = uVar90;
  auVar164 = ZEXT3264(local_2880);
  local_26c0._16_16_ = mm_lookupmask_ps._240_16_;
  local_26c0._0_16_ = mm_lookupmask_ps._240_16_;
  local_2520 = vperm2f128_avx(local_26c0,mm_lookupmask_ps._0_32_,2);
  uVar90 = auVar91._0_4_;
  local_2740._4_4_ = uVar90;
  local_2740._0_4_ = uVar90;
  local_2740._8_4_ = uVar90;
  local_2740._12_4_ = uVar90;
  local_2740._16_4_ = uVar90;
  local_2740._20_4_ = uVar90;
  local_2740._24_4_ = uVar90;
  local_2740._28_4_ = uVar90;
  auVar109._8_4_ = 0x3f800000;
  auVar109._0_8_ = 0x3f8000003f800000;
  auVar109._12_4_ = 0x3f800000;
  auVar109._16_4_ = 0x3f800000;
  auVar109._20_4_ = 0x3f800000;
  auVar109._24_4_ = 0x3f800000;
  auVar109._28_4_ = 0x3f800000;
  auVar117._8_4_ = 0xbf800000;
  auVar117._0_8_ = 0xbf800000bf800000;
  auVar117._12_4_ = 0xbf800000;
  auVar117._16_4_ = 0xbf800000;
  auVar117._20_4_ = 0xbf800000;
  auVar117._24_4_ = 0xbf800000;
  auVar117._28_4_ = 0xbf800000;
  _local_2540 = vblendvps_avx(auVar109,auVar117,local_2520);
  uVar90 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
  local_28a0._4_4_ = uVar90;
  local_28a0._0_4_ = uVar90;
  local_28a0._8_4_ = uVar90;
  local_28a0._12_4_ = uVar90;
  local_28a0._16_4_ = uVar90;
  local_28a0._20_4_ = uVar90;
  local_28a0._24_4_ = uVar90;
  local_28a0._28_4_ = uVar90;
  auVar150 = ZEXT3264(local_28a0);
  local_2820 = auVar108._0_4_;
  fStack_281c = auVar108._0_4_;
  fStack_2818 = auVar108._0_4_;
  fStack_2814 = auVar108._0_4_;
  fStack_2810 = auVar108._0_4_;
  fStack_280c = auVar108._0_4_;
  fStack_2808 = auVar108._0_4_;
  fStack_2804 = auVar108._0_4_;
  local_2958 = ray;
  local_2960 = uVar67;
  local_2968 = uVar71;
  local_2970 = uVar72;
  local_2978 = uVar68;
  local_2980 = uVar76;
  local_29f0 = uVar73;
  fVar87 = auVar108._0_4_;
  fVar88 = auVar108._0_4_;
  fVar89 = auVar108._0_4_;
  fVar98 = auVar108._0_4_;
  fVar104 = auVar108._0_4_;
  fVar105 = auVar108._0_4_;
  local_2a18 = context;
  do {
    auVar86 = ZEXT464((uint)fVar1);
LAB_01539a67:
    do {
      if (pauVar70 == (undefined1 (*) [16])&local_23a0) {
        return;
      }
      pauVar64 = pauVar70 + -1;
      pauVar70 = pauVar70 + -1;
    } while (auVar86._0_4_ < *(float *)(*pauVar64 + 8));
    uVar66 = *(ulong *)*pauVar70;
LAB_01539a8b:
    if ((uVar66 & 8) == 0) {
      uVar90 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
      auVar82._4_4_ = uVar90;
      auVar82._0_4_ = uVar90;
      auVar82._8_4_ = uVar90;
      auVar82._12_4_ = uVar90;
      auVar82._16_4_ = uVar90;
      auVar82._20_4_ = uVar90;
      auVar82._24_4_ = uVar90;
      auVar82._28_4_ = uVar90;
      uVar58 = uVar66 & 0xfffffffffffffff0;
      auVar99 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar58 + 0x100 + uVar67),auVar82,
                                *(undefined1 (*) [32])(uVar58 + 0x40 + uVar67));
      auVar117 = vsubps_avx(ZEXT1632(auVar99),auVar136._0_32_);
      auVar99 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar58 + 0x100 + uVar71),auVar82,
                                *(undefined1 (*) [32])(uVar58 + 0x40 + uVar71));
      auVar22._4_4_ = auVar131._4_4_ * auVar117._4_4_;
      auVar22._0_4_ = auVar131._0_4_ * auVar117._0_4_;
      auVar22._8_4_ = auVar131._8_4_ * auVar117._8_4_;
      auVar22._12_4_ = auVar131._12_4_ * auVar117._12_4_;
      auVar22._16_4_ = auVar131._16_4_ * auVar117._16_4_;
      auVar22._20_4_ = auVar131._20_4_ * auVar117._20_4_;
      auVar22._24_4_ = auVar131._24_4_ * auVar117._24_4_;
      auVar22._28_4_ = auVar117._28_4_;
      auVar117 = vsubps_avx(ZEXT1632(auVar99),auVar144._0_32_);
      auVar26._4_4_ = auVar170._4_4_ * auVar117._4_4_;
      auVar26._0_4_ = auVar170._0_4_ * auVar117._0_4_;
      auVar26._8_4_ = auVar170._8_4_ * auVar117._8_4_;
      auVar26._12_4_ = auVar170._12_4_ * auVar117._12_4_;
      auVar26._16_4_ = auVar170._16_4_ * auVar117._16_4_;
      auVar26._20_4_ = auVar170._20_4_ * auVar117._20_4_;
      auVar26._24_4_ = auVar170._24_4_ * auVar117._24_4_;
      auVar26._28_4_ = auVar117._28_4_;
      auVar99 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar58 + 0x100 + uVar72),auVar82,
                                *(undefined1 (*) [32])(uVar58 + 0x40 + uVar72));
      auVar117 = vsubps_avx(ZEXT1632(auVar99),auVar150._0_32_);
      auVar23._4_4_ = auVar180._4_4_ * auVar117._4_4_;
      auVar23._0_4_ = auVar180._0_4_ * auVar117._0_4_;
      auVar23._8_4_ = auVar180._8_4_ * auVar117._8_4_;
      auVar23._12_4_ = auVar180._12_4_ * auVar117._12_4_;
      auVar23._16_4_ = auVar180._16_4_ * auVar117._16_4_;
      auVar23._20_4_ = auVar180._20_4_ * auVar117._20_4_;
      auVar23._24_4_ = auVar180._24_4_ * auVar117._24_4_;
      auVar23._28_4_ = auVar117._28_4_;
      auVar117 = vmaxps_avx(auVar26,auVar23);
      auVar109 = vmaxps_avx(auVar164._0_32_,auVar22);
      _local_26a0 = vmaxps_avx(auVar109,auVar117);
      auVar99 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar58 + 0x100 + uVar68),auVar82,
                                *(undefined1 (*) [32])(uVar58 + 0x40 + uVar68));
      auVar117 = vsubps_avx(ZEXT1632(auVar99),auVar136._0_32_);
      auVar118._4_4_ = fVar87 * auVar117._4_4_;
      auVar118._0_4_ = auVar108._0_4_ * auVar117._0_4_;
      auVar118._8_4_ = fVar88 * auVar117._8_4_;
      auVar118._12_4_ = fVar89 * auVar117._12_4_;
      auVar118._16_4_ = fVar98 * auVar117._16_4_;
      auVar118._20_4_ = fVar104 * auVar117._20_4_;
      auVar118._24_4_ = fVar105 * auVar117._24_4_;
      auVar118._28_4_ = auVar117._28_4_;
      auVar99 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar58 + 0x100 + uVar76),auVar82,
                                *(undefined1 (*) [32])(uVar58 + 0x40 + uVar76));
      auVar117 = vsubps_avx(ZEXT1632(auVar99),auVar144._0_32_);
      auVar24._4_4_ = auVar188._4_4_ * auVar117._4_4_;
      auVar24._0_4_ = auVar188._0_4_ * auVar117._0_4_;
      auVar24._8_4_ = auVar188._8_4_ * auVar117._8_4_;
      auVar24._12_4_ = auVar188._12_4_ * auVar117._12_4_;
      auVar24._16_4_ = auVar188._16_4_ * auVar117._16_4_;
      auVar24._20_4_ = auVar188._20_4_ * auVar117._20_4_;
      auVar24._24_4_ = auVar188._24_4_ * auVar117._24_4_;
      auVar24._28_4_ = auVar117._28_4_;
      auVar99 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar58 + 0x100 + uVar73),auVar82,
                                *(undefined1 (*) [32])(uVar58 + 0x40 + uVar73));
      auVar117 = vsubps_avx(ZEXT1632(auVar99),auVar150._0_32_);
      auVar143._4_4_ = auVar153._4_4_ * auVar117._4_4_;
      auVar143._0_4_ = auVar153._0_4_ * auVar117._0_4_;
      auVar143._8_4_ = auVar153._8_4_ * auVar117._8_4_;
      auVar143._12_4_ = auVar153._12_4_ * auVar117._12_4_;
      auVar143._16_4_ = auVar153._16_4_ * auVar117._16_4_;
      auVar143._20_4_ = auVar153._20_4_ * auVar117._20_4_;
      auVar143._24_4_ = auVar153._24_4_ * auVar117._24_4_;
      auVar143._28_4_ = auVar117._28_4_;
      auVar117 = vminps_avx(auVar24,auVar143);
      auVar109 = vminps_avx(local_2740,auVar118);
      auVar117 = vminps_avx(auVar109,auVar117);
      auVar117 = vcmpps_avx(_local_26a0,auVar117,2);
      if (((uint)uVar66 & 7) == 6) {
        auVar109 = vcmpps_avx(*(undefined1 (*) [32])(uVar58 + 0x1c0),auVar82,2);
        auVar22 = vcmpps_avx(auVar82,*(undefined1 (*) [32])(uVar58 + 0x1e0),1);
        auVar109 = vandps_avx(auVar109,auVar22);
        auVar117 = vandps_avx(auVar109,auVar117);
        auVar99 = vpackssdw_avx(auVar117._0_16_,auVar117._16_16_);
      }
      else {
        auVar99 = vpackssdw_avx(auVar117._0_16_,auVar117._16_16_);
      }
      auVar99 = vpsllw_avx(auVar99,0xf);
      if ((((((((auVar99 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar99 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar99 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar99 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar99 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar99 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar99 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar99[0xf] < '\0'
         ) {
        auVar99 = vpacksswb_avx(auVar99,auVar99);
        bVar25 = SUB161(auVar99 >> 7,0) & 1 | (SUB161(auVar99 >> 0xf,0) & 1) << 1 |
                 (SUB161(auVar99 >> 0x17,0) & 1) << 2 | (SUB161(auVar99 >> 0x1f,0) & 1) << 3 |
                 (SUB161(auVar99 >> 0x27,0) & 1) << 4 | (SUB161(auVar99 >> 0x2f,0) & 1) << 5 |
                 (SUB161(auVar99 >> 0x37,0) & 1) << 6 | SUB161(auVar99 >> 0x3f,0) << 7;
        lVar59 = 0;
        for (uVar66 = (ulong)bVar25; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000) {
          lVar59 = lVar59 + 1;
        }
        uVar66 = *(ulong *)(uVar58 + lVar59 * 8);
        uVar61 = bVar25 - 1 & (uint)bVar25;
        uVar62 = (ulong)uVar61;
        if (uVar61 != 0) {
          uVar57 = *(uint *)(local_26a0 + lVar59 * 4);
          lVar59 = 0;
          for (; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000) {
            lVar59 = lVar59 + 1;
          }
          uVar61 = uVar61 - 1 & uVar61;
          uVar63 = (ulong)uVar61;
          uVar62 = *(ulong *)(uVar58 + lVar59 * 8);
          uVar55 = *(uint *)(local_26a0 + lVar59 * 4);
          if (uVar61 == 0) {
            if (uVar57 < uVar55) {
              *(ulong *)*pauVar70 = uVar62;
              *(uint *)(*pauVar70 + 8) = uVar55;
              pauVar70 = pauVar70 + 1;
            }
            else {
              *(ulong *)*pauVar70 = uVar66;
              *(uint *)(*pauVar70 + 8) = uVar57;
              uVar66 = uVar62;
              pauVar70 = pauVar70 + 1;
            }
          }
          else {
            auVar77._8_8_ = 0;
            auVar77._0_8_ = uVar66;
            auVar99 = vpunpcklqdq_avx(auVar77,ZEXT416(uVar57));
            auVar91._8_8_ = 0;
            auVar91._0_8_ = uVar62;
            auVar121 = vpunpcklqdq_avx(auVar91,ZEXT416(uVar55));
            lVar59 = 0;
            for (; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
              lVar59 = lVar59 + 1;
            }
            uVar61 = uVar61 - 1 & uVar61;
            uVar66 = (ulong)uVar61;
            auVar100._8_8_ = 0;
            auVar100._0_8_ = *(ulong *)(uVar58 + lVar59 * 8);
            auVar91 = vpunpcklqdq_avx(auVar100,ZEXT416(*(uint *)(local_26a0 + lVar59 * 4)));
            auVar77 = vpcmpgtd_avx(auVar121,auVar99);
            if (uVar61 == 0) {
              auVar122 = vpshufd_avx(auVar77,0xaa);
              auVar77 = vblendvps_avx(auVar121,auVar99,auVar122);
              auVar99 = vblendvps_avx(auVar99,auVar121,auVar122);
              auVar121 = vpcmpgtd_avx(auVar91,auVar77);
              auVar122 = vpshufd_avx(auVar121,0xaa);
              auVar121 = vblendvps_avx(auVar91,auVar77,auVar122);
              auVar77 = vblendvps_avx(auVar77,auVar91,auVar122);
              auVar91 = vpcmpgtd_avx(auVar77,auVar99);
              auVar122 = vpshufd_avx(auVar91,0xaa);
              auVar91 = vblendvps_avx(auVar77,auVar99,auVar122);
              auVar99 = vblendvps_avx(auVar99,auVar77,auVar122);
              *pauVar70 = auVar99;
              pauVar70[1] = auVar91;
              uVar66 = auVar121._0_8_;
              pauVar70 = pauVar70 + 2;
            }
            else {
              lVar59 = 0;
              for (; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000) {
                lVar59 = lVar59 + 1;
              }
              uVar61 = uVar61 - 1 & uVar61;
              uVar66 = (ulong)uVar61;
              auVar112._8_8_ = 0;
              auVar112._0_8_ = *(ulong *)(uVar58 + lVar59 * 8);
              auVar122 = vpunpcklqdq_avx(auVar112,ZEXT416(*(uint *)(local_26a0 + lVar59 * 4)));
              if (uVar61 == 0) {
                auVar111 = vpshufd_avx(auVar77,0xaa);
                auVar77 = vblendvps_avx(auVar121,auVar99,auVar111);
                auVar99 = vblendvps_avx(auVar99,auVar121,auVar111);
                auVar121 = vpcmpgtd_avx(auVar122,auVar91);
                auVar111 = vpshufd_avx(auVar121,0xaa);
                auVar121 = vblendvps_avx(auVar122,auVar91,auVar111);
                auVar91 = vblendvps_avx(auVar91,auVar122,auVar111);
                auVar122 = vpcmpgtd_avx(auVar91,auVar99);
                auVar111 = vpshufd_avx(auVar122,0xaa);
                auVar122 = vblendvps_avx(auVar91,auVar99,auVar111);
                auVar99 = vblendvps_avx(auVar99,auVar91,auVar111);
                auVar91 = vpcmpgtd_avx(auVar121,auVar77);
                auVar111 = vpshufd_avx(auVar91,0xaa);
                auVar91 = vblendvps_avx(auVar121,auVar77,auVar111);
                auVar121 = vblendvps_avx(auVar77,auVar121,auVar111);
                auVar77 = vpcmpgtd_avx(auVar122,auVar121);
                auVar111 = vpshufd_avx(auVar77,0xaa);
                auVar77 = vblendvps_avx(auVar122,auVar121,auVar111);
                auVar121 = vblendvps_avx(auVar121,auVar122,auVar111);
                *pauVar70 = auVar99;
                pauVar70[1] = auVar121;
                pauVar70[2] = auVar77;
                uVar66 = auVar91._0_8_;
                pauVar64 = pauVar70 + 3;
              }
              else {
                *pauVar70 = auVar99;
                pauVar70[1] = auVar121;
                pauVar70[2] = auVar91;
                pauVar64 = pauVar70 + 3;
                pauVar70[3] = auVar122;
                do {
                  lVar59 = 0;
                  for (uVar73 = uVar66; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000
                      ) {
                    lVar59 = lVar59 + 1;
                  }
                  auVar78._8_8_ = 0;
                  auVar78._0_8_ = *(ulong *)(uVar58 + lVar59 * 8);
                  auVar99 = vpunpcklqdq_avx(auVar78,ZEXT416(*(uint *)(local_26a0 + lVar59 * 4)));
                  pauVar64[1] = auVar99;
                  pauVar64 = pauVar64 + 1;
                  uVar66 = uVar66 - 1 & uVar66;
                } while (uVar66 != 0);
                lVar59 = 0;
                while (pauVar64 != pauVar70) {
                  auVar99 = pauVar70[1];
                  uVar61 = vextractps_avx(auVar99,2);
                  for (lVar69 = 0x10;
                      (lVar59 != lVar69 && (*(uint *)(pauVar70[-1] + lVar69 + 8) < uVar61));
                      lVar69 = lVar69 + -0x10) {
                    *(undefined1 (*) [16])(*pauVar70 + lVar69) =
                         *(undefined1 (*) [16])(pauVar70[-1] + lVar69);
                  }
                  *(undefined1 (*) [16])(*pauVar70 + lVar69) = auVar99;
                  lVar59 = lVar59 + -0x10;
                  pauVar70 = pauVar70 + 1;
                }
                uVar66 = *(ulong *)*pauVar64;
                auVar170 = ZEXT3264(local_27e0);
                auVar180 = ZEXT3264(local_2800);
                auVar188 = ZEXT3264(local_2840);
                auVar153 = ZEXT3264(local_2860);
                auVar164 = ZEXT3264(local_2880);
                uVar73 = local_29f0;
                auVar108._0_4_ = local_2820;
                fVar87 = fStack_281c;
                fVar88 = fStack_2818;
                fVar89 = fStack_2814;
                fVar98 = fStack_2810;
                fVar104 = fStack_280c;
                fVar105 = fStack_2808;
              }
              auVar131 = ZEXT3264(auVar131._0_32_);
              auVar150 = ZEXT3264(local_28a0);
              pauVar70 = pauVar64;
            }
          }
        }
        goto LAB_01539a8b;
      }
      auVar99 = vmovshdup_avx(SUB3216(*(undefined1 (*) [32])
                                       ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc),0));
      auVar86 = ZEXT1664(auVar99);
      goto LAB_01539a67;
    }
    local_2990 = (ulong)((uint)uVar66 & 0xf) - 8;
    uVar66 = uVar66 & 0xfffffffffffffff0;
    local_2950 = pauVar70;
    local_2a20 = uVar66;
    for (local_2988 = 0; local_2988 != local_2990; local_2988 = local_2988 + 1) {
      lVar59 = local_2988 * 0xe0;
      uVar58 = *(ulong *)(uVar66 + 0x40 + lVar59);
      auVar79._8_8_ = 0;
      auVar79._0_8_ = uVar58;
      auVar117 = vpmovzxbd_avx2(auVar79);
      uVar90 = *(undefined4 *)(uVar66 + 0x7c + lVar59);
      auVar126._4_4_ = uVar90;
      auVar126._0_4_ = uVar90;
      auVar126._8_4_ = uVar90;
      auVar126._12_4_ = uVar90;
      auVar126._16_4_ = uVar90;
      auVar126._20_4_ = uVar90;
      auVar126._24_4_ = uVar90;
      auVar126._28_4_ = uVar90;
      uVar90 = *(undefined4 *)(uVar66 + 0x70 + lVar59);
      auVar132._4_4_ = uVar90;
      auVar132._0_4_ = uVar90;
      auVar132._8_4_ = uVar90;
      auVar132._12_4_ = uVar90;
      auVar132._16_4_ = uVar90;
      auVar132._20_4_ = uVar90;
      auVar132._24_4_ = uVar90;
      auVar132._28_4_ = uVar90;
      auVar117 = vcvtdq2ps_avx(auVar117);
      auVar99 = vfmadd213ps_fma(auVar117,auVar126,auVar132);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = *(ulong *)(uVar66 + 0x88 + lVar59);
      auVar117 = vpmovzxbd_avx2(auVar3);
      uVar90 = *(undefined4 *)(uVar66 + 0xc4 + lVar59);
      auVar137._4_4_ = uVar90;
      auVar137._0_4_ = uVar90;
      auVar137._8_4_ = uVar90;
      auVar137._12_4_ = uVar90;
      auVar137._16_4_ = uVar90;
      auVar137._20_4_ = uVar90;
      auVar137._24_4_ = uVar90;
      auVar137._28_4_ = uVar90;
      uVar90 = *(undefined4 *)(uVar66 + 0xb8 + lVar59);
      auVar145._4_4_ = uVar90;
      auVar145._0_4_ = uVar90;
      auVar145._8_4_ = uVar90;
      auVar145._12_4_ = uVar90;
      auVar145._16_4_ = uVar90;
      auVar145._20_4_ = uVar90;
      auVar145._24_4_ = uVar90;
      auVar145._28_4_ = uVar90;
      auVar117 = vcvtdq2ps_avx(auVar117);
      auVar121 = vfmadd213ps_fma(auVar117,auVar137,auVar145);
      auVar92._8_8_ = 0;
      auVar92._0_8_ = *(ulong *)(uVar66 + 0x48 + lVar59);
      auVar117 = vpmovzxbd_avx2(auVar92);
      auVar117 = vcvtdq2ps_avx(auVar117);
      auVar77 = vfmadd213ps_fma(auVar117,auVar126,auVar132);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = *(ulong *)(uVar66 + 0x90 + lVar59);
      auVar117 = vpmovzxbd_avx2(auVar4);
      auVar117 = vcvtdq2ps_avx(auVar117);
      auVar91 = vfmadd213ps_fma(auVar117,auVar137,auVar145);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = *(ulong *)(uVar66 + 0x50 + lVar59);
      auVar117 = vpmovzxbd_avx2(auVar5);
      auVar117 = vcvtdq2ps_avx(auVar117);
      uVar90 = *(undefined4 *)(uVar66 + 0x80 + lVar59);
      auVar151._4_4_ = uVar90;
      auVar151._0_4_ = uVar90;
      auVar151._8_4_ = uVar90;
      auVar151._12_4_ = uVar90;
      auVar151._16_4_ = uVar90;
      auVar151._20_4_ = uVar90;
      auVar151._24_4_ = uVar90;
      auVar151._28_4_ = uVar90;
      uVar90 = *(undefined4 *)(uVar66 + 0x74 + lVar59);
      auVar160._4_4_ = uVar90;
      auVar160._0_4_ = uVar90;
      auVar160._8_4_ = uVar90;
      auVar160._12_4_ = uVar90;
      auVar160._16_4_ = uVar90;
      auVar160._20_4_ = uVar90;
      auVar160._24_4_ = uVar90;
      auVar160._28_4_ = uVar90;
      auVar122 = vfmadd213ps_fma(auVar117,auVar151,auVar160);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *(ulong *)(uVar66 + 0x98 + lVar59);
      auVar117 = vpmovzxbd_avx2(auVar6);
      auVar117 = vcvtdq2ps_avx(auVar117);
      uVar90 = *(undefined4 *)(uVar66 + 200 + lVar59);
      auVar166._4_4_ = uVar90;
      auVar166._0_4_ = uVar90;
      auVar166._8_4_ = uVar90;
      auVar166._12_4_ = uVar90;
      auVar166._16_4_ = uVar90;
      auVar166._20_4_ = uVar90;
      auVar166._24_4_ = uVar90;
      auVar166._28_4_ = uVar90;
      uVar90 = *(undefined4 *)(uVar66 + 0xbc + lVar59);
      auVar178._4_4_ = uVar90;
      auVar178._0_4_ = uVar90;
      auVar178._8_4_ = uVar90;
      auVar178._12_4_ = uVar90;
      auVar178._16_4_ = uVar90;
      auVar178._20_4_ = uVar90;
      auVar178._24_4_ = uVar90;
      auVar178._28_4_ = uVar90;
      auVar108 = vfmadd213ps_fma(auVar117,auVar166,auVar178);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *(ulong *)(uVar66 + 0x58 + lVar59);
      auVar117 = vpmovzxbd_avx2(auVar7);
      auVar117 = vcvtdq2ps_avx(auVar117);
      auVar111 = vfmadd213ps_fma(auVar117,auVar151,auVar160);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = *(ulong *)(uVar66 + 0xa0 + lVar59);
      auVar117 = vpmovzxbd_avx2(auVar8);
      auVar117 = vcvtdq2ps_avx(auVar117);
      auVar123 = vfmadd213ps_fma(auVar117,auVar166,auVar178);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = *(ulong *)(uVar66 + 0x60 + lVar59);
      auVar117 = vpmovzxbd_avx2(auVar9);
      auVar117 = vcvtdq2ps_avx(auVar117);
      uVar90 = *(undefined4 *)(uVar66 + 0x84 + lVar59);
      auVar167._4_4_ = uVar90;
      auVar167._0_4_ = uVar90;
      auVar167._8_4_ = uVar90;
      auVar167._12_4_ = uVar90;
      auVar167._16_4_ = uVar90;
      auVar167._20_4_ = uVar90;
      auVar167._24_4_ = uVar90;
      auVar167._28_4_ = uVar90;
      uVar90 = *(undefined4 *)(uVar66 + 0x78 + lVar59);
      auVar179._4_4_ = uVar90;
      auVar179._0_4_ = uVar90;
      auVar179._8_4_ = uVar90;
      auVar179._12_4_ = uVar90;
      auVar179._16_4_ = uVar90;
      auVar179._20_4_ = uVar90;
      auVar179._24_4_ = uVar90;
      auVar179._28_4_ = uVar90;
      auVar100 = vfmadd213ps_fma(auVar117,auVar167,auVar179);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = *(ulong *)(uVar66 + 0xa8 + lVar59);
      auVar117 = vpmovzxbd_avx2(auVar10);
      auVar117 = vcvtdq2ps_avx(auVar117);
      uVar90 = *(undefined4 *)(uVar66 + 0xcc + lVar59);
      auVar187._4_4_ = uVar90;
      auVar187._0_4_ = uVar90;
      auVar187._8_4_ = uVar90;
      auVar187._12_4_ = uVar90;
      auVar187._16_4_ = uVar90;
      auVar187._20_4_ = uVar90;
      auVar187._24_4_ = uVar90;
      auVar187._28_4_ = uVar90;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = *(ulong *)(uVar66 + 0x68 + lVar59);
      auVar109 = vpmovzxbd_avx2(auVar11);
      auVar109 = vcvtdq2ps_avx(auVar109);
      auVar112 = vfmadd213ps_fma(auVar109,auVar167,auVar179);
      uVar90 = *(undefined4 *)(uVar66 + 0xc0 + lVar59);
      auVar168._4_4_ = uVar90;
      auVar168._0_4_ = uVar90;
      auVar168._8_4_ = uVar90;
      auVar168._12_4_ = uVar90;
      auVar168._16_4_ = uVar90;
      auVar168._20_4_ = uVar90;
      auVar168._24_4_ = uVar90;
      auVar168._28_4_ = uVar90;
      auVar78 = vfmadd213ps_fma(auVar117,auVar187,auVar168);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = *(ulong *)(uVar66 + 0xb0 + lVar59);
      auVar117 = vpmovzxbd_avx2(auVar12);
      auVar117 = vcvtdq2ps_avx(auVar117);
      auVar3 = vfmadd213ps_fma(auVar117,auVar187,auVar168);
      auVar188 = ZEXT3264(local_2840);
      fVar1 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(uVar66 + 0xd0 + lVar59)) *
              *(float *)(uVar66 + 0xd4 + lVar59);
      auVar169._4_4_ = fVar1;
      auVar169._0_4_ = fVar1;
      auVar169._8_4_ = fVar1;
      auVar169._12_4_ = fVar1;
      auVar169._16_4_ = fVar1;
      auVar169._20_4_ = fVar1;
      auVar169._24_4_ = fVar1;
      auVar169._28_4_ = fVar1;
      auVar117 = vsubps_avx(ZEXT1632(auVar121),ZEXT1632(auVar99));
      auVar121 = vfmadd213ps_fma(auVar117,auVar169,ZEXT1632(auVar99));
      auVar117 = vsubps_avx(ZEXT1632(auVar91),ZEXT1632(auVar77));
      auVar77 = vfmadd213ps_fma(auVar117,auVar169,ZEXT1632(auVar77));
      auVar117 = vsubps_avx(ZEXT1632(auVar108),ZEXT1632(auVar122));
      auVar91 = vfmadd213ps_fma(auVar117,auVar169,ZEXT1632(auVar122));
      auVar117 = vsubps_avx(ZEXT1632(auVar123),ZEXT1632(auVar111));
      auVar153 = ZEXT3264(local_2860);
      auVar122 = vfmadd213ps_fma(auVar117,auVar169,ZEXT1632(auVar111));
      auVar150 = ZEXT3264(local_28a0);
      auVar117 = vsubps_avx(ZEXT1632(auVar78),ZEXT1632(auVar100));
      auVar108 = vfmadd213ps_fma(auVar117,auVar169,ZEXT1632(auVar100));
      auVar164 = ZEXT3264(local_2880);
      auVar117 = vsubps_avx(ZEXT1632(auVar3),ZEXT1632(auVar112));
      auVar180 = ZEXT3264(local_2800);
      auVar111 = vfmadd213ps_fma(auVar117,auVar169,ZEXT1632(auVar112));
      auVar170 = ZEXT3264(local_27e0);
      auVar99 = vpminub_avx(auVar79,auVar92);
      auVar80._8_8_ = 0;
      auVar80._0_8_ = uVar58;
      local_2a00 = vpcmpeqb_avx(auVar80,auVar99);
      auVar123 = local_2a00;
      auVar117 = vsubps_avx(ZEXT1632(auVar121),local_26e0);
      auVar27._4_4_ = auVar117._4_4_ * (float)local_2720._4_4_;
      auVar27._0_4_ = auVar117._0_4_ * (float)local_2720._0_4_;
      auVar27._8_4_ = auVar117._8_4_ * fStack_2718;
      auVar27._12_4_ = auVar117._12_4_ * fStack_2714;
      auVar27._16_4_ = auVar117._16_4_ * fStack_2710;
      auVar27._20_4_ = auVar117._20_4_ * fStack_270c;
      auVar27._24_4_ = auVar117._24_4_ * fStack_2708;
      auVar27._28_4_ = auVar117._28_4_;
      auVar117 = vsubps_avx(ZEXT1632(auVar91),local_2700);
      auVar28._4_4_ = local_27e0._4_4_ * auVar117._4_4_;
      auVar28._0_4_ = local_27e0._0_4_ * auVar117._0_4_;
      auVar28._8_4_ = local_27e0._8_4_ * auVar117._8_4_;
      auVar28._12_4_ = local_27e0._12_4_ * auVar117._12_4_;
      auVar28._16_4_ = local_27e0._16_4_ * auVar117._16_4_;
      auVar28._20_4_ = local_27e0._20_4_ * auVar117._20_4_;
      auVar28._24_4_ = local_27e0._24_4_ * auVar117._24_4_;
      auVar28._28_4_ = auVar117._28_4_;
      auVar117 = vsubps_avx(ZEXT1632(auVar77),local_26e0);
      auVar29._4_4_ = fStack_281c * auVar117._4_4_;
      auVar29._0_4_ = local_2820 * auVar117._0_4_;
      auVar29._8_4_ = fStack_2818 * auVar117._8_4_;
      auVar29._12_4_ = fStack_2814 * auVar117._12_4_;
      auVar29._16_4_ = fStack_2810 * auVar117._16_4_;
      auVar29._20_4_ = fStack_280c * auVar117._20_4_;
      auVar29._24_4_ = fStack_2808 * auVar117._24_4_;
      auVar29._28_4_ = auVar117._28_4_;
      auVar117 = vsubps_avx(ZEXT1632(auVar122),local_2700);
      auVar30._4_4_ = local_2840._4_4_ * auVar117._4_4_;
      auVar30._0_4_ = local_2840._0_4_ * auVar117._0_4_;
      auVar30._8_4_ = local_2840._8_4_ * auVar117._8_4_;
      auVar30._12_4_ = local_2840._12_4_ * auVar117._12_4_;
      auVar30._16_4_ = local_2840._16_4_ * auVar117._16_4_;
      auVar30._20_4_ = local_2840._20_4_ * auVar117._20_4_;
      auVar30._24_4_ = local_2840._24_4_ * auVar117._24_4_;
      auVar30._28_4_ = auVar117._28_4_;
      auVar117 = vpminsd_avx2(auVar27,auVar29);
      auVar109 = vpmaxsd_avx2(auVar27,auVar29);
      auVar22 = vpminsd_avx2(auVar28,auVar30);
      auVar22 = vpmaxsd_avx2(auVar117,auVar22);
      auVar26 = vpmaxsd_avx2(auVar28,auVar30);
      auVar117 = vsubps_avx(ZEXT1632(auVar108),local_28a0);
      auVar31._4_4_ = local_2800._4_4_ * auVar117._4_4_;
      auVar31._0_4_ = local_2800._0_4_ * auVar117._0_4_;
      auVar31._8_4_ = local_2800._8_4_ * auVar117._8_4_;
      auVar31._12_4_ = local_2800._12_4_ * auVar117._12_4_;
      auVar31._16_4_ = local_2800._16_4_ * auVar117._16_4_;
      auVar31._20_4_ = local_2800._20_4_ * auVar117._20_4_;
      auVar31._24_4_ = local_2800._24_4_ * auVar117._24_4_;
      auVar31._28_4_ = auVar117._28_4_;
      auVar117 = vsubps_avx(ZEXT1632(auVar111),local_28a0);
      auVar32._4_4_ = local_2860._4_4_ * auVar117._4_4_;
      auVar32._0_4_ = local_2860._0_4_ * auVar117._0_4_;
      auVar32._8_4_ = local_2860._8_4_ * auVar117._8_4_;
      auVar32._12_4_ = local_2860._12_4_ * auVar117._12_4_;
      auVar32._16_4_ = local_2860._16_4_ * auVar117._16_4_;
      auVar32._20_4_ = local_2860._20_4_ * auVar117._20_4_;
      auVar32._24_4_ = local_2860._24_4_ * auVar117._24_4_;
      auVar32._28_4_ = auVar117._28_4_;
      auVar26 = vpminsd_avx2(auVar109,auVar26);
      auVar109 = vpminsd_avx2(auVar31,auVar32);
      auVar117 = vpmaxsd_avx2(auVar31,auVar32);
      auVar109 = vpmaxsd_avx2(auVar109,local_2880);
      local_23c0 = vpmaxsd_avx2(auVar22,auVar109);
      auVar117 = vpminsd_avx2(auVar117,local_2740);
      auVar117 = vpminsd_avx2(auVar26,auVar117);
      auVar117 = vpcmpgtd_avx2(local_23c0,auVar117);
      auVar99 = vpackssdw_avx(SUB3216(auVar117 ^ _DAT_01f7b020,0),
                              SUB3216(auVar117 ^ _DAT_01f7b020,0x10));
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_2a00._0_8_;
      auVar121 = vpmovzxbw_avx(auVar13);
      auVar99 = vpand_avx(auVar99,auVar121);
      auVar99 = vpshufb_avx(auVar99,_DAT_01fb8680);
      local_2948 = lVar59 + uVar66;
      local_2928 = (ulong)(byte)(SUB161(auVar99 >> 7,0) & 1 | (SUB161(auVar99 >> 0xf,0) & 1) << 1 |
                                 (SUB161(auVar99 >> 0x17,0) & 1) << 2 |
                                 (SUB161(auVar99 >> 0x1f,0) & 1) << 3 |
                                 (SUB161(auVar99 >> 0x27,0) & 1) << 4 |
                                 (SUB161(auVar99 >> 0x2f,0) & 1) << 5 |
                                 (SUB161(auVar99 >> 0x37,0) & 1) << 6 |
                                SUB161(auVar99 >> 0x3f,0) << 7);
      auVar108._0_4_ = local_2820;
      fVar87 = fStack_281c;
      fVar88 = fStack_2818;
      fVar89 = fStack_2814;
      fVar98 = fStack_2810;
      fVar104 = fStack_280c;
      fVar105 = fStack_2808;
      local_2a00 = auVar123;
      while (pRVar54 = local_2958, local_2928 != 0) {
        lVar59 = 0;
        for (uVar58 = local_2928; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
          lVar59 = lVar59 + 1;
        }
        local_2928 = local_2928 - 1 & local_2928;
        fVar1 = (ray->super_RayK<1>).tfar;
        if (*(float *)(local_23c0 + lVar59 * 4) <= fVar1) {
          local_2750 = ZEXT416((uint)fVar1);
          uVar14 = *(ushort *)(local_2948 + lVar59 * 8);
          uVar15 = *(ushort *)(local_2948 + 2 + lVar59 * 8);
          uVar61 = *(uint *)(local_2948 + 0xd8);
          uVar67 = CONCAT44(0,uVar61);
          uVar57 = *(uint *)(local_2948 + 4 + lVar59 * 8);
          local_2930 = context->scene;
          local_2a00._0_8_ = uVar67;
          pGVar16 = (local_2930->geometries).items[uVar67].ptr;
          local_2938 = *(long *)&pGVar16->field_0x58;
          local_29e8 = (ulong)uVar57;
          local_2940 = pGVar16[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i
                       * (ulong)uVar57;
          auVar108._0_4_ = (pGVar16->time_range).lower;
          auVar108._0_4_ =
               pGVar16->fnumTimeSegments *
               (((ray->super_RayK<1>).dir.field_0.m128[3] - auVar108._0_4_) /
               ((pGVar16->time_range).upper - auVar108._0_4_));
          auVar99 = vroundss_avx(ZEXT416((uint)auVar108._0_4_),ZEXT416((uint)auVar108._0_4_),9);
          auVar99 = vminss_avx(auVar99,ZEXT416((uint)(pGVar16->fnumTimeSegments + -1.0)));
          auVar122 = vmaxss_avx(ZEXT816(0),auVar99);
          local_2a08 = uVar14 & 0x7fff;
          local_2a0c = uVar15 & 0x7fff;
          uVar55 = *(uint *)(local_2938 + 4 + local_2940);
          uVar72 = (ulong)uVar55;
          uVar71 = (ulong)(uVar55 * local_2a0c + *(int *)(local_2938 + local_2940) + local_2a08);
          lVar69 = *(long *)&pGVar16[2].numPrimitives;
          lVar74 = (long)(int)auVar122._0_4_ * 0x38;
          lVar17 = *(long *)(lVar69 + 0x10 + lVar74);
          lVar18 = *(long *)(lVar69 + lVar74);
          auVar99 = *(undefined1 (*) [16])(lVar18 + lVar17 * uVar71);
          lVar19 = *(long *)(lVar69 + 0x48 + lVar74);
          auVar121 = *(undefined1 (*) [16])(lVar18 + (uVar71 + 1) * lVar17);
          lVar59 = uVar71 + uVar72;
          auVar77 = *(undefined1 (*) [16])(lVar18 + lVar59 * lVar17);
          lVar75 = uVar71 + uVar72 + 1;
          auVar111 = *(undefined1 (*) [16])(lVar18 + lVar75 * lVar17);
          lVar60 = uVar71 + (-1 < (short)uVar14) + 1;
          auVar123 = *(undefined1 (*) [16])(lVar18 + lVar60 * lVar17);
          lVar65 = (ulong)(-1 < (short)uVar14) + lVar75;
          auVar91 = *(undefined1 (*) [16])(lVar18 + lVar65 * lVar17);
          uVar68 = 0;
          if (-1 < (short)uVar15) {
            uVar68 = uVar72;
          }
          auVar100 = *(undefined1 (*) [16])(lVar18 + (lVar59 + uVar68) * lVar17);
          auVar112 = *(undefined1 (*) [16])(lVar18 + (lVar75 + uVar68) * lVar17);
          auVar78 = *(undefined1 (*) [16])(lVar18 + lVar17 * (uVar68 + lVar65));
          lVar69 = *(long *)(lVar69 + 0x38 + lVar74);
          auVar108._0_4_ = auVar108._0_4_ - auVar122._0_4_;
          auVar81._4_4_ = auVar108._0_4_;
          auVar81._0_4_ = auVar108._0_4_;
          auVar81._8_4_ = auVar108._0_4_;
          auVar81._12_4_ = auVar108._0_4_;
          auVar122 = vsubps_avx(*(undefined1 (*) [16])(lVar69 + lVar19 * uVar71),auVar99);
          auVar3 = vfmadd213ps_fma(auVar122,auVar81,auVar99);
          auVar99 = vsubps_avx(*(undefined1 (*) [16])(lVar69 + lVar19 * (uVar71 + 1)),auVar121);
          auVar4 = vfmadd213ps_fma(auVar99,auVar81,auVar121);
          auVar99 = vsubps_avx(*(undefined1 (*) [16])(lVar69 + lVar19 * lVar59),auVar77);
          auVar5 = vfmadd213ps_fma(auVar99,auVar81,auVar77);
          auVar99 = vsubps_avx(*(undefined1 (*) [16])(lVar69 + lVar19 * lVar75),auVar111);
          auVar6 = vfmadd213ps_fma(auVar99,auVar81,auVar111);
          auVar99 = vsubps_avx(*(undefined1 (*) [16])(lVar69 + lVar19 * lVar60),auVar123);
          auVar121 = vfmadd213ps_fma(auVar99,auVar81,auVar123);
          auVar99 = vsubps_avx(*(undefined1 (*) [16])(lVar69 + lVar19 * lVar65),auVar91);
          auVar7 = vfmadd213ps_fma(auVar99,auVar81,auVar91);
          auVar99 = vsubps_avx(*(undefined1 (*) [16])(lVar69 + lVar19 * (lVar59 + uVar68)),auVar100)
          ;
          auVar123 = vfmadd213ps_fma(auVar99,auVar81,auVar100);
          auVar99 = vsubps_avx(*(undefined1 (*) [16])(lVar69 + lVar19 * (lVar75 + uVar68)),auVar112)
          ;
          auVar100 = vfmadd213ps_fma(auVar99,auVar81,auVar112);
          auVar99 = vsubps_avx(*(undefined1 (*) [16])(lVar69 + (uVar68 + lVar65) * lVar19),auVar78);
          auVar112 = vfmadd213ps_fma(auVar99,auVar81,auVar78);
          auVar77 = vunpcklps_avx(auVar4,auVar7);
          auVar99 = vunpckhps_avx(auVar4,auVar7);
          auVar91 = vunpcklps_avx(auVar121,auVar6);
          auVar121 = vunpckhps_avx(auVar121,auVar6);
          auVar122 = vunpcklps_avx(auVar99,auVar121);
          auVar108 = vunpcklps_avx(auVar77,auVar91);
          auVar99 = vunpckhps_avx(auVar77,auVar91);
          auVar91 = vunpcklps_avx(auVar5,auVar100);
          auVar121 = vunpckhps_avx(auVar5,auVar100);
          auVar111 = vunpcklps_avx(auVar6,auVar123);
          auVar77 = vunpckhps_avx(auVar6,auVar123);
          auVar77 = vunpcklps_avx(auVar121,auVar77);
          auVar123 = vunpcklps_avx(auVar91,auVar111);
          auVar121 = vunpckhps_avx(auVar91,auVar111);
          auVar138._16_16_ = auVar100;
          auVar138._0_16_ = auVar5;
          auVar101._16_16_ = auVar7;
          auVar101._0_16_ = auVar4;
          auVar117 = vunpcklps_avx(auVar101,auVar138);
          auVar113._16_16_ = auVar112;
          auVar113._0_16_ = auVar6;
          auVar94._16_16_ = auVar6;
          auVar94._0_16_ = auVar3;
          auVar109 = vunpcklps_avx(auVar94,auVar113);
          auVar26 = vunpcklps_avx(auVar109,auVar117);
          auVar117 = vunpckhps_avx(auVar109,auVar117);
          auVar109 = vunpckhps_avx(auVar101,auVar138);
          auVar22 = vunpckhps_avx(auVar94,auVar113);
          auVar109 = vunpcklps_avx(auVar22,auVar109);
          auVar102._16_16_ = auVar108;
          auVar102._0_16_ = auVar108;
          auVar83._16_16_ = auVar99;
          auVar83._0_16_ = auVar99;
          auVar114._16_16_ = auVar122;
          auVar114._0_16_ = auVar122;
          auVar127._16_16_ = auVar123;
          auVar127._0_16_ = auVar123;
          auVar139._16_16_ = auVar121;
          auVar139._0_16_ = auVar121;
          uVar90 = *(undefined4 *)&(local_2958->super_RayK<1>).org.field_0;
          auVar146._4_4_ = uVar90;
          auVar146._0_4_ = uVar90;
          auVar146._8_4_ = uVar90;
          auVar146._12_4_ = uVar90;
          auVar146._16_4_ = uVar90;
          auVar146._20_4_ = uVar90;
          auVar146._24_4_ = uVar90;
          auVar146._28_4_ = uVar90;
          uVar90 = *(undefined4 *)((long)&(local_2958->super_RayK<1>).org.field_0 + 4);
          auVar152._4_4_ = uVar90;
          auVar152._0_4_ = uVar90;
          auVar152._8_4_ = uVar90;
          auVar152._12_4_ = uVar90;
          auVar152._16_4_ = uVar90;
          auVar152._20_4_ = uVar90;
          auVar152._24_4_ = uVar90;
          auVar152._28_4_ = uVar90;
          auVar133._16_16_ = auVar77;
          auVar133._0_16_ = auVar77;
          uVar90 = *(undefined4 *)((long)&(local_2958->super_RayK<1>).org.field_0 + 8);
          auVar161._4_4_ = uVar90;
          auVar161._0_4_ = uVar90;
          auVar161._8_4_ = uVar90;
          auVar161._12_4_ = uVar90;
          auVar161._16_4_ = uVar90;
          auVar161._20_4_ = uVar90;
          auVar161._24_4_ = uVar90;
          auVar161._28_4_ = uVar90;
          local_27a0 = vsubps_avx(auVar26,auVar146);
          local_27c0 = vsubps_avx(auVar117,auVar152);
          local_28c0 = vsubps_avx(auVar109,auVar161);
          auVar117 = vsubps_avx(auVar102,auVar146);
          auVar109 = vsubps_avx(auVar83,auVar152);
          auVar22 = vsubps_avx(auVar114,auVar161);
          auVar26 = vsubps_avx(auVar127,auVar146);
          auVar23 = vsubps_avx(auVar139,auVar152);
          auVar118 = vsubps_avx(auVar133,auVar161);
          local_23e0 = vsubps_avx(auVar26,local_27a0);
          local_2420 = vsubps_avx(auVar23,local_27c0);
          local_2400 = vsubps_avx(auVar118,local_28c0);
          auVar84._0_4_ = auVar26._0_4_ + local_27a0._0_4_;
          auVar84._4_4_ = auVar26._4_4_ + local_27a0._4_4_;
          auVar84._8_4_ = auVar26._8_4_ + local_27a0._8_4_;
          auVar84._12_4_ = auVar26._12_4_ + local_27a0._12_4_;
          auVar84._16_4_ = auVar26._16_4_ + local_27a0._16_4_;
          auVar84._20_4_ = auVar26._20_4_ + local_27a0._20_4_;
          auVar84._24_4_ = auVar26._24_4_ + local_27a0._24_4_;
          auVar84._28_4_ = auVar26._28_4_ + local_27a0._28_4_;
          auVar110._0_4_ = auVar23._0_4_ + local_27c0._0_4_;
          auVar110._4_4_ = auVar23._4_4_ + local_27c0._4_4_;
          auVar110._8_4_ = auVar23._8_4_ + local_27c0._8_4_;
          auVar110._12_4_ = auVar23._12_4_ + local_27c0._12_4_;
          auVar110._16_4_ = auVar23._16_4_ + local_27c0._16_4_;
          auVar110._20_4_ = auVar23._20_4_ + local_27c0._20_4_;
          auVar110._24_4_ = auVar23._24_4_ + local_27c0._24_4_;
          fVar154 = auVar23._28_4_;
          auVar110._28_4_ = fVar154 + local_27c0._28_4_;
          fVar177 = local_28c0._0_4_;
          auVar134._0_4_ = fVar177 + auVar118._0_4_;
          fVar181 = local_28c0._4_4_;
          auVar134._4_4_ = fVar181 + auVar118._4_4_;
          fVar182 = local_28c0._8_4_;
          auVar134._8_4_ = fVar182 + auVar118._8_4_;
          fVar183 = local_28c0._12_4_;
          auVar134._12_4_ = fVar183 + auVar118._12_4_;
          fVar184 = local_28c0._16_4_;
          auVar134._16_4_ = fVar184 + auVar118._16_4_;
          fVar185 = local_28c0._20_4_;
          auVar134._20_4_ = fVar185 + auVar118._20_4_;
          fVar186 = local_28c0._24_4_;
          auVar134._24_4_ = fVar186 + auVar118._24_4_;
          auVar134._28_4_ = local_28c0._28_4_ + auVar118._28_4_;
          auVar33._4_4_ = local_2400._4_4_ * auVar110._4_4_;
          auVar33._0_4_ = local_2400._0_4_ * auVar110._0_4_;
          auVar33._8_4_ = local_2400._8_4_ * auVar110._8_4_;
          auVar33._12_4_ = local_2400._12_4_ * auVar110._12_4_;
          auVar33._16_4_ = local_2400._16_4_ * auVar110._16_4_;
          auVar33._20_4_ = local_2400._20_4_ * auVar110._20_4_;
          auVar33._24_4_ = local_2400._24_4_ * auVar110._24_4_;
          auVar33._28_4_ = auVar121._12_4_;
          auVar121 = vfmsub231ps_fma(auVar33,local_2420,auVar134);
          auVar34._4_4_ = local_23e0._4_4_ * auVar134._4_4_;
          auVar34._0_4_ = local_23e0._0_4_ * auVar134._0_4_;
          auVar34._8_4_ = local_23e0._8_4_ * auVar134._8_4_;
          auVar34._12_4_ = local_23e0._12_4_ * auVar134._12_4_;
          auVar34._16_4_ = local_23e0._16_4_ * auVar134._16_4_;
          auVar34._20_4_ = local_23e0._20_4_ * auVar134._20_4_;
          auVar34._24_4_ = local_23e0._24_4_ * auVar134._24_4_;
          auVar34._28_4_ = auVar134._28_4_;
          auVar99 = vfmsub231ps_fma(auVar34,local_2400,auVar84);
          auVar35._4_4_ = local_2420._4_4_ * auVar84._4_4_;
          auVar35._0_4_ = local_2420._0_4_ * auVar84._0_4_;
          auVar35._8_4_ = local_2420._8_4_ * auVar84._8_4_;
          auVar35._12_4_ = local_2420._12_4_ * auVar84._12_4_;
          auVar35._16_4_ = local_2420._16_4_ * auVar84._16_4_;
          auVar35._20_4_ = local_2420._20_4_ * auVar84._20_4_;
          auVar35._24_4_ = local_2420._24_4_ * auVar84._24_4_;
          auVar35._28_4_ = auVar84._28_4_;
          auVar77 = vfmsub231ps_fma(auVar35,local_23e0,auVar110);
          uVar90 = *(undefined4 *)((long)&(local_2958->super_RayK<1>).dir.field_0 + 4);
          local_29c0._4_4_ = uVar90;
          local_29c0._0_4_ = uVar90;
          local_29c0._8_4_ = uVar90;
          local_29c0._12_4_ = uVar90;
          local_29c0._16_4_ = uVar90;
          local_29c0._20_4_ = uVar90;
          local_29c0._24_4_ = uVar90;
          local_29c0._28_4_ = uVar90;
          local_2440 = (local_2958->super_RayK<1>).dir.field_0.m128[2];
          auVar36._4_4_ = local_2440 * auVar77._4_4_;
          auVar36._0_4_ = local_2440 * auVar77._0_4_;
          auVar36._8_4_ = local_2440 * auVar77._8_4_;
          auVar36._12_4_ = local_2440 * auVar77._12_4_;
          auVar36._16_4_ = local_2440 * 0.0;
          auVar36._20_4_ = local_2440 * 0.0;
          auVar36._24_4_ = local_2440 * 0.0;
          auVar36._28_4_ = local_2420._28_4_;
          auVar99 = vfmadd231ps_fma(auVar36,local_29c0,ZEXT1632(auVar99));
          uVar90 = *(undefined4 *)&(local_2958->super_RayK<1>).dir.field_0;
          local_29e0._4_4_ = uVar90;
          local_29e0._0_4_ = uVar90;
          local_29e0._8_4_ = uVar90;
          local_29e0._12_4_ = uVar90;
          local_29e0._16_4_ = uVar90;
          local_29e0._20_4_ = uVar90;
          local_29e0._24_4_ = uVar90;
          local_29e0._28_4_ = uVar90;
          auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),local_29e0,ZEXT1632(auVar121));
          local_2460 = vsubps_avx(local_27c0,auVar109);
          local_2480 = vsubps_avx(local_28c0,auVar22);
          auVar135._0_4_ = local_27c0._0_4_ + auVar109._0_4_;
          auVar135._4_4_ = local_27c0._4_4_ + auVar109._4_4_;
          auVar135._8_4_ = local_27c0._8_4_ + auVar109._8_4_;
          auVar135._12_4_ = local_27c0._12_4_ + auVar109._12_4_;
          auVar135._16_4_ = local_27c0._16_4_ + auVar109._16_4_;
          auVar135._20_4_ = local_27c0._20_4_ + auVar109._20_4_;
          auVar135._24_4_ = local_27c0._24_4_ + auVar109._24_4_;
          auVar135._28_4_ = local_27c0._28_4_ + auVar109._28_4_;
          auVar140._0_4_ = fVar177 + auVar22._0_4_;
          auVar140._4_4_ = fVar181 + auVar22._4_4_;
          auVar140._8_4_ = fVar182 + auVar22._8_4_;
          auVar140._12_4_ = fVar183 + auVar22._12_4_;
          auVar140._16_4_ = fVar184 + auVar22._16_4_;
          auVar140._20_4_ = fVar185 + auVar22._20_4_;
          auVar140._24_4_ = fVar186 + auVar22._24_4_;
          auVar108._0_4_ = auVar22._28_4_;
          auVar140._28_4_ = local_28c0._28_4_ + auVar108._0_4_;
          fVar87 = local_2480._0_4_;
          fVar88 = local_2480._4_4_;
          auVar37._4_4_ = auVar135._4_4_ * fVar88;
          auVar37._0_4_ = auVar135._0_4_ * fVar87;
          fVar89 = local_2480._8_4_;
          auVar37._8_4_ = auVar135._8_4_ * fVar89;
          fVar98 = local_2480._12_4_;
          auVar37._12_4_ = auVar135._12_4_ * fVar98;
          fVar104 = local_2480._16_4_;
          auVar37._16_4_ = auVar135._16_4_ * fVar104;
          fVar105 = local_2480._20_4_;
          auVar37._20_4_ = auVar135._20_4_ * fVar105;
          fVar106 = local_2480._24_4_;
          auVar37._24_4_ = auVar135._24_4_ * fVar106;
          auVar37._28_4_ = auVar108._0_4_;
          auVar77 = vfmsub231ps_fma(auVar37,local_2460,auVar140);
          local_24a0 = vsubps_avx(local_27a0,auVar117);
          fVar189 = local_24a0._0_4_;
          fVar190 = local_24a0._4_4_;
          auVar38._4_4_ = fVar190 * auVar140._4_4_;
          auVar38._0_4_ = fVar189 * auVar140._0_4_;
          fVar191 = local_24a0._8_4_;
          auVar38._8_4_ = fVar191 * auVar140._8_4_;
          fVar192 = local_24a0._12_4_;
          auVar38._12_4_ = fVar192 * auVar140._12_4_;
          fVar193 = local_24a0._16_4_;
          auVar38._16_4_ = fVar193 * auVar140._16_4_;
          fVar194 = local_24a0._20_4_;
          auVar38._20_4_ = fVar194 * auVar140._20_4_;
          fVar195 = local_24a0._24_4_;
          auVar38._24_4_ = fVar195 * auVar140._24_4_;
          auVar38._28_4_ = local_2400._28_4_;
          auVar141._0_4_ = auVar117._0_4_ + local_27a0._0_4_;
          auVar141._4_4_ = auVar117._4_4_ + local_27a0._4_4_;
          auVar141._8_4_ = auVar117._8_4_ + local_27a0._8_4_;
          auVar141._12_4_ = auVar117._12_4_ + local_27a0._12_4_;
          auVar141._16_4_ = auVar117._16_4_ + local_27a0._16_4_;
          auVar141._20_4_ = auVar117._20_4_ + local_27a0._20_4_;
          auVar141._24_4_ = auVar117._24_4_ + local_27a0._24_4_;
          auVar141._28_4_ = auVar117._28_4_ + local_27a0._28_4_;
          auVar121 = vfmsub231ps_fma(auVar38,local_2480,auVar141);
          fVar165 = local_2460._0_4_;
          fVar171 = local_2460._4_4_;
          auVar39._4_4_ = fVar171 * auVar141._4_4_;
          auVar39._0_4_ = fVar165 * auVar141._0_4_;
          fVar172 = local_2460._8_4_;
          auVar39._8_4_ = fVar172 * auVar141._8_4_;
          fVar173 = local_2460._12_4_;
          auVar39._12_4_ = fVar173 * auVar141._12_4_;
          fVar174 = local_2460._16_4_;
          auVar39._16_4_ = fVar174 * auVar141._16_4_;
          fVar175 = local_2460._20_4_;
          auVar39._20_4_ = fVar175 * auVar141._20_4_;
          fVar176 = local_2460._24_4_;
          auVar39._24_4_ = fVar176 * auVar141._24_4_;
          auVar39._28_4_ = auVar141._28_4_;
          auVar91 = vfmsub231ps_fma(auVar39,local_24a0,auVar135);
          auVar142._0_4_ = local_2440 * auVar91._0_4_;
          auVar142._4_4_ = local_2440 * auVar91._4_4_;
          auVar142._8_4_ = local_2440 * auVar91._8_4_;
          auVar142._12_4_ = local_2440 * auVar91._12_4_;
          auVar142._16_4_ = local_2440 * 0.0;
          auVar142._20_4_ = local_2440 * 0.0;
          auVar142._24_4_ = local_2440 * 0.0;
          auVar142._28_4_ = 0;
          auVar121 = vfmadd231ps_fma(auVar142,local_29c0,ZEXT1632(auVar121));
          auVar121 = vfmadd231ps_fma(ZEXT1632(auVar121),local_29e0,ZEXT1632(auVar77));
          auVar24 = vsubps_avx(auVar117,auVar26);
          auVar128._0_4_ = auVar117._0_4_ + auVar26._0_4_;
          auVar128._4_4_ = auVar117._4_4_ + auVar26._4_4_;
          auVar128._8_4_ = auVar117._8_4_ + auVar26._8_4_;
          auVar128._12_4_ = auVar117._12_4_ + auVar26._12_4_;
          auVar128._16_4_ = auVar117._16_4_ + auVar26._16_4_;
          auVar128._20_4_ = auVar117._20_4_ + auVar26._20_4_;
          auVar128._24_4_ = auVar117._24_4_ + auVar26._24_4_;
          auVar128._28_4_ = auVar117._28_4_ + auVar26._28_4_;
          auVar26 = vsubps_avx(auVar109,auVar23);
          auVar115._0_4_ = auVar23._0_4_ + auVar109._0_4_;
          auVar115._4_4_ = auVar23._4_4_ + auVar109._4_4_;
          auVar115._8_4_ = auVar23._8_4_ + auVar109._8_4_;
          auVar115._12_4_ = auVar23._12_4_ + auVar109._12_4_;
          auVar115._16_4_ = auVar23._16_4_ + auVar109._16_4_;
          auVar115._20_4_ = auVar23._20_4_ + auVar109._20_4_;
          auVar115._24_4_ = auVar23._24_4_ + auVar109._24_4_;
          auVar115._28_4_ = fVar154 + auVar109._28_4_;
          auVar23 = vsubps_avx(auVar22,auVar118);
          auVar95._0_4_ = auVar22._0_4_ + auVar118._0_4_;
          auVar95._4_4_ = auVar22._4_4_ + auVar118._4_4_;
          auVar95._8_4_ = auVar22._8_4_ + auVar118._8_4_;
          auVar95._12_4_ = auVar22._12_4_ + auVar118._12_4_;
          auVar95._16_4_ = auVar22._16_4_ + auVar118._16_4_;
          auVar95._20_4_ = auVar22._20_4_ + auVar118._20_4_;
          auVar95._24_4_ = auVar22._24_4_ + auVar118._24_4_;
          auVar95._28_4_ = auVar108._0_4_ + auVar118._28_4_;
          auVar40._4_4_ = auVar23._4_4_ * auVar115._4_4_;
          auVar40._0_4_ = auVar23._0_4_ * auVar115._0_4_;
          auVar40._8_4_ = auVar23._8_4_ * auVar115._8_4_;
          auVar40._12_4_ = auVar23._12_4_ * auVar115._12_4_;
          auVar40._16_4_ = auVar23._16_4_ * auVar115._16_4_;
          auVar40._20_4_ = auVar23._20_4_ * auVar115._20_4_;
          auVar40._24_4_ = auVar23._24_4_ * auVar115._24_4_;
          auVar40._28_4_ = fVar154;
          auVar91 = vfmsub231ps_fma(auVar40,auVar26,auVar95);
          auVar41._4_4_ = auVar95._4_4_ * auVar24._4_4_;
          auVar41._0_4_ = auVar95._0_4_ * auVar24._0_4_;
          auVar41._8_4_ = auVar95._8_4_ * auVar24._8_4_;
          auVar41._12_4_ = auVar95._12_4_ * auVar24._12_4_;
          auVar41._16_4_ = auVar95._16_4_ * auVar24._16_4_;
          auVar41._20_4_ = auVar95._20_4_ * auVar24._20_4_;
          auVar41._24_4_ = auVar95._24_4_ * auVar24._24_4_;
          auVar41._28_4_ = auVar95._28_4_;
          auVar77 = vfmsub231ps_fma(auVar41,auVar23,auVar128);
          auVar42._4_4_ = auVar26._4_4_ * auVar128._4_4_;
          auVar42._0_4_ = auVar26._0_4_ * auVar128._0_4_;
          auVar42._8_4_ = auVar26._8_4_ * auVar128._8_4_;
          auVar42._12_4_ = auVar26._12_4_ * auVar128._12_4_;
          auVar42._16_4_ = auVar26._16_4_ * auVar128._16_4_;
          auVar42._20_4_ = auVar26._20_4_ * auVar128._20_4_;
          auVar42._24_4_ = auVar26._24_4_ * auVar128._24_4_;
          auVar42._28_4_ = auVar128._28_4_;
          auVar122 = vfmsub231ps_fma(auVar42,auVar24,auVar115);
          fStack_243c = local_2440;
          fStack_2438 = local_2440;
          fStack_2434 = local_2440;
          fStack_2430 = local_2440;
          fStack_242c = local_2440;
          fStack_2428 = local_2440;
          fStack_2424 = local_2440;
          auVar129._0_4_ = local_2440 * auVar122._0_4_;
          auVar129._4_4_ = local_2440 * auVar122._4_4_;
          auVar129._8_4_ = local_2440 * auVar122._8_4_;
          auVar129._12_4_ = local_2440 * auVar122._12_4_;
          auVar129._16_4_ = local_2440 * 0.0;
          auVar129._20_4_ = local_2440 * 0.0;
          auVar129._24_4_ = local_2440 * 0.0;
          auVar129._28_4_ = 0;
          auVar77 = vfmadd231ps_fma(auVar129,local_29c0,ZEXT1632(auVar77));
          auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),local_29e0,ZEXT1632(auVar91));
          auVar93._0_4_ = auVar77._0_4_ + auVar99._0_4_ + auVar121._0_4_;
          auVar93._4_4_ = auVar77._4_4_ + auVar99._4_4_ + auVar121._4_4_;
          auVar93._8_4_ = auVar77._8_4_ + auVar99._8_4_ + auVar121._8_4_;
          auVar93._12_4_ = auVar77._12_4_ + auVar99._12_4_ + auVar121._12_4_;
          local_2660 = ZEXT1632(auVar93);
          auVar116._8_4_ = 0x7fffffff;
          auVar116._0_8_ = 0x7fffffff7fffffff;
          auVar116._12_4_ = 0x7fffffff;
          auVar116._16_4_ = 0x7fffffff;
          auVar116._20_4_ = 0x7fffffff;
          auVar116._24_4_ = 0x7fffffff;
          auVar116._28_4_ = 0x7fffffff;
          local_24c0 = ZEXT1632(auVar99);
          auVar117 = vminps_avx(local_24c0,ZEXT1632(auVar121));
          auVar117 = vminps_avx(auVar117,ZEXT1632(auVar77));
          local_2500 = vandps_avx(local_2660,auVar116);
          auVar108._0_4_ = local_2500._0_4_ * 1.1920929e-07;
          fVar154 = local_2500._4_4_ * 1.1920929e-07;
          auVar43._4_4_ = fVar154;
          auVar43._0_4_ = auVar108._0_4_;
          fVar155 = local_2500._8_4_ * 1.1920929e-07;
          auVar43._8_4_ = fVar155;
          fVar156 = local_2500._12_4_ * 1.1920929e-07;
          auVar43._12_4_ = fVar156;
          fVar157 = local_2500._16_4_ * 1.1920929e-07;
          auVar43._16_4_ = fVar157;
          fVar158 = local_2500._20_4_ * 1.1920929e-07;
          auVar43._20_4_ = fVar158;
          fVar159 = local_2500._24_4_ * 1.1920929e-07;
          auVar43._24_4_ = fVar159;
          auVar43._28_4_ = 0x34000000;
          auVar162._0_8_ = CONCAT44(fVar154,auVar108._0_4_) ^ 0x8000000080000000;
          auVar162._8_4_ = -fVar155;
          auVar162._12_4_ = -fVar156;
          auVar162._16_4_ = -fVar157;
          auVar162._20_4_ = -fVar158;
          auVar162._24_4_ = -fVar159;
          auVar162._28_4_ = 0xb4000000;
          auVar117 = vcmpps_avx(auVar117,auVar162,5);
          auVar143 = ZEXT1632(auVar121);
          auVar22 = vmaxps_avx(local_24c0,auVar143);
          auVar109 = vmaxps_avx(auVar22,ZEXT1632(auVar77));
          auVar109 = vcmpps_avx(auVar109,auVar43,2);
          local_24e0 = vorps_avx(auVar117,auVar109);
          auVar118 = local_26c0 & local_24e0;
          if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar118 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar118 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar118 >> 0x7f,0) != '\0') ||
                (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar118 >> 0xbf,0) != '\0') ||
              (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar118[0x1f] < '\0') {
            auVar44._4_4_ = local_2400._4_4_ * fVar171;
            auVar44._0_4_ = local_2400._0_4_ * fVar165;
            auVar44._8_4_ = local_2400._8_4_ * fVar172;
            auVar44._12_4_ = local_2400._12_4_ * fVar173;
            auVar44._16_4_ = local_2400._16_4_ * fVar174;
            auVar44._20_4_ = local_2400._20_4_ * fVar175;
            auVar44._24_4_ = local_2400._24_4_ * fVar176;
            auVar44._28_4_ = auVar109._28_4_;
            auVar45._4_4_ = local_2420._4_4_ * fVar190;
            auVar45._0_4_ = local_2420._0_4_ * fVar189;
            auVar45._8_4_ = local_2420._8_4_ * fVar191;
            auVar45._12_4_ = local_2420._12_4_ * fVar192;
            auVar45._16_4_ = local_2420._16_4_ * fVar193;
            auVar45._20_4_ = local_2420._20_4_ * fVar194;
            auVar45._24_4_ = local_2420._24_4_ * fVar195;
            auVar45._28_4_ = auVar117._28_4_;
            auVar99 = vfmsub213ps_fma(local_2420,local_2480,auVar44);
            auVar46._4_4_ = auVar26._4_4_ * fVar88;
            auVar46._0_4_ = auVar26._0_4_ * fVar87;
            auVar46._8_4_ = auVar26._8_4_ * fVar89;
            auVar46._12_4_ = auVar26._12_4_ * fVar98;
            auVar46._16_4_ = auVar26._16_4_ * fVar104;
            auVar46._20_4_ = auVar26._20_4_ * fVar105;
            auVar46._24_4_ = auVar26._24_4_ * fVar106;
            auVar46._28_4_ = 0x34000000;
            auVar47._4_4_ = auVar23._4_4_ * fVar190;
            auVar47._0_4_ = auVar23._0_4_ * fVar189;
            auVar47._8_4_ = auVar23._8_4_ * fVar191;
            auVar47._12_4_ = auVar23._12_4_ * fVar192;
            auVar47._16_4_ = auVar23._16_4_ * fVar193;
            auVar47._20_4_ = auVar23._20_4_ * fVar194;
            auVar47._24_4_ = auVar23._24_4_ * fVar195;
            auVar47._28_4_ = auVar22._28_4_;
            auVar121 = vfmsub213ps_fma(auVar23,local_2460,auVar46);
            auVar117 = vandps_avx(auVar44,auVar116);
            auVar109 = vandps_avx(auVar46,auVar116);
            auVar117 = vcmpps_avx(auVar117,auVar109,1);
            auVar22 = vblendvps_avx(ZEXT1632(auVar121),ZEXT1632(auVar99),auVar117);
            auVar48._4_4_ = fVar171 * auVar24._4_4_;
            auVar48._0_4_ = fVar165 * auVar24._0_4_;
            auVar48._8_4_ = fVar172 * auVar24._8_4_;
            auVar48._12_4_ = fVar173 * auVar24._12_4_;
            auVar48._16_4_ = fVar174 * auVar24._16_4_;
            auVar48._20_4_ = fVar175 * auVar24._20_4_;
            auVar48._24_4_ = fVar176 * auVar24._24_4_;
            auVar48._28_4_ = auVar109._28_4_;
            auVar99 = vfmsub213ps_fma(auVar24,local_2480,auVar47);
            auVar49._4_4_ = local_23e0._4_4_ * fVar88;
            auVar49._0_4_ = local_23e0._0_4_ * fVar87;
            auVar49._8_4_ = local_23e0._8_4_ * fVar89;
            auVar49._12_4_ = local_23e0._12_4_ * fVar98;
            auVar49._16_4_ = local_23e0._16_4_ * fVar104;
            auVar49._20_4_ = local_23e0._20_4_ * fVar105;
            auVar49._24_4_ = local_23e0._24_4_ * fVar106;
            auVar49._28_4_ = local_2480._28_4_;
            auVar121 = vfmsub213ps_fma(local_2400,local_24a0,auVar49);
            auVar117 = vandps_avx(auVar49,auVar116);
            auVar109 = vandps_avx(auVar47,auVar116);
            auVar117 = vcmpps_avx(auVar117,auVar109,1);
            auVar23 = vblendvps_avx(ZEXT1632(auVar99),ZEXT1632(auVar121),auVar117);
            auVar99 = vfmsub213ps_fma(local_23e0,local_2460,auVar45);
            auVar121 = vfmsub213ps_fma(auVar26,local_24a0,auVar48);
            auVar117 = vandps_avx(auVar45,auVar116);
            auVar109 = vandps_avx(auVar48,auVar116);
            auVar117 = vcmpps_avx(auVar117,auVar109,1);
            auVar26 = vblendvps_avx(ZEXT1632(auVar121),ZEXT1632(auVar99),auVar117);
            fVar98 = auVar26._0_4_;
            fVar104 = auVar26._4_4_;
            auVar50._4_4_ = fVar104 * local_2440;
            auVar50._0_4_ = fVar98 * local_2440;
            fVar105 = auVar26._8_4_;
            auVar50._8_4_ = fVar105 * local_2440;
            fVar106 = auVar26._12_4_;
            auVar50._12_4_ = fVar106 * local_2440;
            fVar154 = auVar26._16_4_;
            auVar50._16_4_ = fVar154 * local_2440;
            fVar155 = auVar26._20_4_;
            auVar50._20_4_ = fVar155 * local_2440;
            fVar156 = auVar26._24_4_;
            auVar50._24_4_ = fVar156 * local_2440;
            auVar50._28_4_ = auVar117._28_4_;
            auVar99 = vfmadd213ps_fma(local_29c0,auVar23,auVar50);
            auVar99 = vfmadd213ps_fma(local_29e0,auVar22,ZEXT1632(auVar99));
            auVar108._0_4_ = auVar99._0_4_ + auVar99._0_4_;
            fVar87 = auVar99._4_4_ + auVar99._4_4_;
            fVar88 = auVar99._8_4_ + auVar99._8_4_;
            fVar89 = auVar99._12_4_ + auVar99._12_4_;
            auVar118 = ZEXT1632(CONCAT412(fVar89,CONCAT48(fVar88,CONCAT44(fVar87,auVar108._0_4_))));
            auVar51._4_4_ = fVar104 * fVar181;
            auVar51._0_4_ = fVar98 * fVar177;
            auVar51._8_4_ = fVar105 * fVar182;
            auVar51._12_4_ = fVar106 * fVar183;
            auVar51._16_4_ = fVar154 * fVar184;
            auVar51._20_4_ = fVar155 * fVar185;
            auVar51._24_4_ = fVar156 * fVar186;
            auVar51._28_4_ = auVar109._28_4_;
            auVar99 = vfmadd213ps_fma(local_27c0,auVar23,auVar51);
            auVar121 = vfmadd213ps_fma(local_27a0,auVar22,ZEXT1632(auVar99));
            auVar117 = vrcpps_avx(auVar118);
            auVar163._8_4_ = 0x3f800000;
            auVar163._0_8_ = 0x3f8000003f800000;
            auVar163._12_4_ = 0x3f800000;
            auVar163._16_4_ = 0x3f800000;
            auVar163._20_4_ = 0x3f800000;
            auVar163._24_4_ = 0x3f800000;
            auVar163._28_4_ = 0x3f800000;
            auVar99 = vfnmadd213ps_fma(auVar117,auVar118,auVar163);
            auVar99 = vfmadd132ps_fma(ZEXT1632(auVar99),auVar117,auVar117);
            uVar90 = *(undefined4 *)((long)&(local_2958->super_RayK<1>).org.field_0 + 0xc);
            auVar147._4_4_ = uVar90;
            auVar147._0_4_ = uVar90;
            auVar147._8_4_ = uVar90;
            auVar147._12_4_ = uVar90;
            auVar147._16_4_ = uVar90;
            auVar147._20_4_ = uVar90;
            auVar147._24_4_ = uVar90;
            auVar147._28_4_ = uVar90;
            local_25c0 = ZEXT1632(CONCAT412(auVar99._12_4_ * (auVar121._12_4_ + auVar121._12_4_),
                                            CONCAT48(auVar99._8_4_ *
                                                     (auVar121._8_4_ + auVar121._8_4_),
                                                     CONCAT44(auVar99._4_4_ *
                                                              (auVar121._4_4_ + auVar121._4_4_),
                                                              auVar99._0_4_ *
                                                              (auVar121._0_4_ + auVar121._0_4_)))));
            auVar131 = ZEXT3264(local_25c0);
            auVar117 = vcmpps_avx(auVar147,local_25c0,2);
            auVar148._4_4_ = fVar1;
            auVar148._0_4_ = fVar1;
            auVar148._8_4_ = fVar1;
            auVar148._12_4_ = fVar1;
            auVar148._16_4_ = fVar1;
            auVar148._20_4_ = fVar1;
            auVar148._24_4_ = fVar1;
            auVar148._28_4_ = fVar1;
            auVar109 = vcmpps_avx(local_25c0,auVar148,2);
            auVar117 = vandps_avx(auVar109,auVar117);
            auVar149._0_8_ = CONCAT44(fVar87,auVar108._0_4_) ^ 0x8000000080000000;
            auVar149._8_4_ = -fVar88;
            auVar149._12_4_ = -fVar89;
            auVar149._16_4_ = 0x80000000;
            auVar149._20_4_ = 0x80000000;
            auVar149._24_4_ = 0x80000000;
            auVar149._28_4_ = 0x80000000;
            auVar109 = vcmpps_avx(auVar149,auVar118,4);
            auVar117 = vandps_avx(auVar109,auVar117);
            auVar109 = vandps_avx(local_24e0,local_26c0);
            auVar117 = vpslld_avx2(auVar117,0x1f);
            auVar118 = vpsrad_avx2(auVar117,0x1f);
            auVar117 = auVar109 & auVar118;
            if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar117 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar117 >> 0x7f,0) != '\0') ||
                  (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar117 >> 0xbf,0) != '\0') ||
                (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar117[0x1f] < '\0') {
              auVar117 = vandps_avx(auVar118,auVar109);
              uVar55 = vextractps_avx(SUB3216(*(undefined1 (*) [32])
                                               ((long)&(local_2958->super_RayK<1>).org.field_0 + 0xc
                                               ),0x10),2);
              local_2640 = &local_2a21;
              local_2620 = auVar117;
              auVar109 = vsubps_avx(local_2660,auVar143);
              auVar109 = vblendvps_avx(local_24c0,auVar109,local_2520);
              auVar118 = vsubps_avx(local_2660,local_24c0);
              local_2680 = vblendvps_avx(auVar143,auVar118,local_2520);
              local_25a0[0] = (float)local_2540._0_4_ * auVar22._0_4_;
              local_25a0[1] = (float)local_2540._4_4_ * auVar22._4_4_;
              local_25a0[2] = fStack_2538 * auVar22._8_4_;
              local_25a0[3] = fStack_2534 * auVar22._12_4_;
              fStack_2590 = fStack_2530 * auVar22._16_4_;
              fStack_258c = fStack_252c * auVar22._20_4_;
              fStack_2588 = fStack_2528 * auVar22._24_4_;
              uStack_2584 = auVar22._28_4_;
              local_2580[0] = (float)local_2540._0_4_ * auVar23._0_4_;
              local_2580[1] = (float)local_2540._4_4_ * auVar23._4_4_;
              local_2580[2] = fStack_2538 * auVar23._8_4_;
              local_2580[3] = fStack_2534 * auVar23._12_4_;
              fStack_2570 = fStack_2530 * auVar23._16_4_;
              fStack_256c = fStack_252c * auVar23._20_4_;
              fStack_2568 = fStack_2528 * auVar23._24_4_;
              uStack_2564 = auVar22._28_4_;
              local_2560[0] = (float)local_2540._0_4_ * fVar98;
              local_2560[1] = (float)local_2540._4_4_ * fVar104;
              local_2560[2] = fStack_2538 * fVar105;
              local_2560[3] = fStack_2534 * fVar106;
              fStack_2550 = fStack_2530 * fVar154;
              fStack_254c = fStack_252c * fVar155;
              fStack_2548 = fStack_2528 * fVar156;
              uStack_2544 = auVar26._28_4_;
              auVar103._0_8_ = (ulong)CONCAT24(uVar14,(uint)uVar14) & 0x7fff00007fff;
              auVar103._8_4_ = local_2a08;
              auVar103._12_4_ = local_2a08;
              auVar103._16_4_ = local_2a08;
              auVar103._20_4_ = local_2a08;
              auVar103._24_4_ = local_2a08;
              auVar103._28_4_ = local_2a08;
              auVar124._0_4_ = (float)(int)(*(ushort *)(local_2938 + 8 + local_2940) - 1);
              auVar124._4_12_ = auVar93._4_12_;
              auVar22 = vpaddd_avx2(auVar103,_DAT_01fb7740);
              auVar99 = vrcpss_avx(auVar124,auVar124);
              auVar121 = vfnmadd213ss_fma(auVar99,auVar124,ZEXT416(0x40000000));
              fStack_2688 = auVar99._0_4_ * auVar121._0_4_;
              auVar22 = vcvtdq2ps_avx(auVar22);
              fStack_2684 = auVar22._28_4_ + auVar109._28_4_;
              local_26a0._0_4_ = (auVar93._0_4_ * auVar22._0_4_ + auVar109._0_4_) * fStack_2688;
              local_26a0._4_4_ = (auVar93._4_4_ * auVar22._4_4_ + auVar109._4_4_) * fStack_2688;
              fStack_2698 = (auVar93._8_4_ * auVar22._8_4_ + auVar109._8_4_) * fStack_2688;
              fStack_2694 = (auVar93._12_4_ * auVar22._12_4_ + auVar109._12_4_) * fStack_2688;
              fStack_2690 = (auVar22._16_4_ * 0.0 + auVar109._16_4_) * fStack_2688;
              fStack_268c = (auVar22._20_4_ * 0.0 + auVar109._20_4_) * fStack_2688;
              fStack_2688 = (auVar22._24_4_ * 0.0 + auVar109._24_4_) * fStack_2688;
              pGVar16 = (local_2930->geometries).items[uVar67].ptr;
              if ((pGVar16->mask & uVar55) != 0) {
                auVar119._0_8_ = (ulong)CONCAT24(uVar15,(uint)uVar15) & 0x7fff00007fff;
                auVar119._8_4_ = local_2a0c;
                auVar119._12_4_ = local_2a0c;
                auVar119._16_4_ = local_2a0c;
                auVar119._20_4_ = local_2a0c;
                auVar119._24_4_ = local_2a0c;
                auVar119._28_4_ = local_2a0c;
                auVar109 = vpaddd_avx2(auVar119,_DAT_01fb7760);
                auVar22 = vcvtdq2ps_avx(auVar109);
                auVar125._0_4_ = (float)(int)(*(ushort *)(local_2938 + 10 + local_2940) - 1);
                auVar125._4_12_ = auVar93._4_12_;
                auVar99 = vrcpss_avx(auVar125,auVar125);
                auVar121 = vfnmadd213ss_fma(auVar99,auVar125,ZEXT416(0x40000000));
                fVar1 = auVar99._0_4_ * auVar121._0_4_;
                local_2780 = auVar117;
                auVar109 = vrcpps_avx(local_2660);
                auVar130._8_4_ = 0x3f800000;
                auVar130._0_8_ = 0x3f8000003f800000;
                auVar130._12_4_ = 0x3f800000;
                auVar130._16_4_ = 0x3f800000;
                auVar130._20_4_ = 0x3f800000;
                auVar130._24_4_ = 0x3f800000;
                auVar130._28_4_ = 0x3f800000;
                auVar99 = vfnmadd213ps_fma(local_2660,auVar109,auVar130);
                auVar99 = vfmadd132ps_fma(ZEXT1632(auVar99),auVar109,auVar109);
                auVar120._8_4_ = 0x219392ef;
                auVar120._0_8_ = 0x219392ef219392ef;
                auVar120._12_4_ = 0x219392ef;
                auVar120._16_4_ = 0x219392ef;
                auVar120._20_4_ = 0x219392ef;
                auVar120._24_4_ = 0x219392ef;
                auVar120._28_4_ = 0x219392ef;
                auVar109 = vcmpps_avx(local_2500,auVar120,5);
                auVar109 = vandps_avx(auVar109,ZEXT1632(auVar99));
                auVar52._4_4_ = (float)local_26a0._4_4_ * auVar109._4_4_;
                auVar52._0_4_ = (float)local_26a0._0_4_ * auVar109._0_4_;
                auVar52._8_4_ = fStack_2698 * auVar109._8_4_;
                auVar52._12_4_ = fStack_2694 * auVar109._12_4_;
                auVar52._16_4_ = fStack_2690 * auVar109._16_4_;
                auVar52._20_4_ = fStack_268c * auVar109._20_4_;
                auVar52._24_4_ = fStack_2688 * auVar109._24_4_;
                auVar52._28_4_ = fStack_2684;
                local_2600 = vminps_avx(auVar52,auVar130);
                auVar53._4_4_ =
                     (auVar93._4_4_ * auVar22._4_4_ + local_2680._4_4_) * fVar1 * auVar109._4_4_;
                auVar53._0_4_ =
                     (auVar93._0_4_ * auVar22._0_4_ + local_2680._0_4_) * fVar1 * auVar109._0_4_;
                auVar53._8_4_ =
                     (auVar93._8_4_ * auVar22._8_4_ + local_2680._8_4_) * fVar1 * auVar109._8_4_;
                auVar53._12_4_ =
                     (auVar93._12_4_ * auVar22._12_4_ + local_2680._12_4_) * fVar1 * auVar109._12_4_
                ;
                auVar53._16_4_ =
                     (auVar22._16_4_ * 0.0 + local_2680._16_4_) * fVar1 * auVar109._16_4_;
                auVar53._20_4_ =
                     (auVar22._20_4_ * 0.0 + local_2680._20_4_) * fVar1 * auVar109._20_4_;
                auVar53._24_4_ =
                     (auVar22._24_4_ * 0.0 + local_2680._24_4_) * fVar1 * auVar109._24_4_;
                auVar53._28_4_ = auVar109._28_4_;
                local_25e0 = vminps_avx(auVar53,auVar130);
                auVar96._8_4_ = 0x7f800000;
                auVar96._0_8_ = 0x7f8000007f800000;
                auVar96._12_4_ = 0x7f800000;
                auVar96._16_4_ = 0x7f800000;
                auVar96._20_4_ = 0x7f800000;
                auVar96._24_4_ = 0x7f800000;
                auVar96._28_4_ = 0x7f800000;
                auVar109 = vblendvps_avx(auVar96,local_25c0,auVar117);
                auVar22 = vshufps_avx(auVar109,auVar109,0xb1);
                auVar22 = vminps_avx(auVar109,auVar22);
                auVar26 = vshufpd_avx(auVar22,auVar22,5);
                auVar22 = vminps_avx(auVar22,auVar26);
                auVar26 = vpermpd_avx2(auVar22,0x4e);
                auVar22 = vminps_avx(auVar22,auVar26);
                auVar109 = vcmpps_avx(auVar109,auVar22,0);
                auVar22 = auVar117 & auVar109;
                if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar22 >> 0x7f,0) != '\0') ||
                      (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar22 >> 0xbf,0) != '\0') ||
                    (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar22[0x1f] < '\0') {
                  auVar117 = vandps_avx(auVar109,auVar117);
                }
                uVar56 = vmovmskps_avx(auVar117);
                uVar55 = 0;
                for (; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x80000000) {
                  uVar55 = uVar55 + 1;
                }
                uVar68 = (ulong)uVar55;
                pRVar20 = local_2a18->args;
                if ((pRVar20->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar16->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  pRVar21 = local_2a18->user;
                  local_29c0 = ZEXT432((uint)(local_2958->super_RayK<1>).tfar);
                  local_29e0 = local_25c0;
                  do {
                    local_28e4 = *(undefined4 *)(local_2600 + uVar68 * 4);
                    local_28e0 = *(undefined4 *)(local_25e0 + uVar68 * 4);
                    (pRVar54->super_RayK<1>).tfar = local_25a0[uVar68 - 8];
                    local_28f0 = local_25a0[uVar68];
                    local_28ec = local_2580[uVar68];
                    local_28e8 = local_2560[uVar68];
                    local_28dc = (int)local_29e8;
                    local_28d8 = local_2a00._0_4_;
                    local_28d4 = pRVar21->instID[0];
                    local_28d0 = pRVar21->instPrimID[0];
                    local_2a04 = -1;
                    local_2920.valid = &local_2a04;
                    local_2920.geometryUserPtr = pGVar16->userPtr;
                    local_2920.context = pRVar21;
                    local_2920.ray = (RTCRayN *)pRVar54;
                    local_2920.hit = (RTCHitN *)&local_28f0;
                    local_2920.N = 1;
                    if (pGVar16->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0153ad69:
                      if ((pRVar20->filter != (RTCFilterFunctionN)0x0) &&
                         (((pRVar20->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar16->field_8).field_0x2 & 0x40) != 0)))) {
                        (*pRVar20->filter)(&local_2920);
                        auVar131 = ZEXT3264(local_29e0);
                        if (*local_2920.valid == 0) goto LAB_0153adfb;
                      }
                      (((Vec3f *)((long)local_2920.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_2920.hit;
                      (((Vec3f *)((long)local_2920.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_2920.hit + 4);
                      (((Vec3f *)((long)local_2920.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_2920.hit + 8);
                      *(float *)((long)local_2920.ray + 0x3c) = *(float *)(local_2920.hit + 0xc);
                      *(float *)((long)local_2920.ray + 0x40) = *(float *)(local_2920.hit + 0x10);
                      *(float *)((long)local_2920.ray + 0x44) = *(float *)(local_2920.hit + 0x14);
                      *(float *)((long)local_2920.ray + 0x48) = *(float *)(local_2920.hit + 0x18);
                      *(float *)((long)local_2920.ray + 0x4c) = *(float *)(local_2920.hit + 0x1c);
                      *(float *)((long)local_2920.ray + 0x50) = *(float *)(local_2920.hit + 0x20);
                    }
                    else {
                      (*pGVar16->intersectionFilterN)(&local_2920);
                      auVar131 = ZEXT3264(local_29e0);
                      if (*local_2920.valid != 0) goto LAB_0153ad69;
LAB_0153adfb:
                      (pRVar54->super_RayK<1>).tfar = (float)local_29c0._0_4_;
                    }
                    *(undefined4 *)(local_2780 + uVar68 * 4) = 0;
                    auVar22 = local_2780;
                    fVar1 = (pRVar54->super_RayK<1>).tfar;
                    auVar85._4_4_ = fVar1;
                    auVar85._0_4_ = fVar1;
                    auVar85._8_4_ = fVar1;
                    auVar85._12_4_ = fVar1;
                    auVar85._16_4_ = fVar1;
                    auVar85._20_4_ = fVar1;
                    auVar85._24_4_ = fVar1;
                    auVar85._28_4_ = fVar1;
                    auVar109 = vcmpps_avx(auVar131._0_32_,auVar85,2);
                    auVar117 = vandps_avx(auVar109,local_2780);
                    local_2780 = auVar117;
                    auVar22 = auVar22 & auVar109;
                    if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar22 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar22 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar22 >> 0x7f,0) == '\0') &&
                          (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar22 >> 0xbf,0) == '\0') &&
                        (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar22[0x1f]) goto LAB_0153abb3;
                    local_29c0 = *(undefined1 (*) [32])&(pRVar54->super_RayK<1>).tfar;
                    auVar97._8_4_ = 0x7f800000;
                    auVar97._0_8_ = 0x7f8000007f800000;
                    auVar97._12_4_ = 0x7f800000;
                    auVar97._16_4_ = 0x7f800000;
                    auVar97._20_4_ = 0x7f800000;
                    auVar97._24_4_ = 0x7f800000;
                    auVar97._28_4_ = 0x7f800000;
                    auVar109 = vblendvps_avx(auVar97,auVar131._0_32_,auVar117);
                    auVar22 = vshufps_avx(auVar109,auVar109,0xb1);
                    auVar22 = vminps_avx(auVar109,auVar22);
                    auVar26 = vshufpd_avx(auVar22,auVar22,5);
                    auVar22 = vminps_avx(auVar22,auVar26);
                    auVar26 = vpermpd_avx2(auVar22,0x4e);
                    auVar22 = vminps_avx(auVar22,auVar26);
                    auVar109 = vcmpps_avx(auVar109,auVar22,0);
                    auVar22 = auVar117 & auVar109;
                    if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar22 >> 0x7f,0) != '\0') ||
                          (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar22 >> 0xbf,0) != '\0') ||
                        (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar22[0x1f] < '\0') {
                      auVar117 = vandps_avx(auVar109,auVar117);
                    }
                    uVar57 = vmovmskps_avx(auVar117);
                    uVar61 = 0;
                    for (; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x80000000) {
                      uVar61 = uVar61 + 1;
                    }
                    uVar68 = (ulong)uVar61;
                  } while( true );
                }
                fVar1 = *(float *)(local_2600 + uVar68 * 4);
                auVar108._0_4_ = *(float *)(local_25e0 + uVar68 * 4);
                fVar87 = local_25a0[uVar68];
                fVar88 = local_2580[uVar68];
                fVar89 = local_2560[uVar68];
                (local_2958->super_RayK<1>).tfar = local_25a0[uVar68 - 8];
                (local_2958->Ng).field_0.field_0.x = fVar87;
                (local_2958->Ng).field_0.field_0.y = fVar88;
                (local_2958->Ng).field_0.field_0.z = fVar89;
                local_2958->u = fVar1;
                local_2958->v = auVar108._0_4_;
                local_2958->primID = uVar57;
                local_2958->geomID = uVar61;
                pRVar21 = local_2a18->user;
                local_2958->instID[0] = pRVar21->instID[0];
                local_2958->instPrimID[0] = pRVar21->instPrimID[0];
              }
            }
          }
LAB_0153abb3:
          auVar170 = ZEXT3264(local_27e0);
          auVar180 = ZEXT3264(local_2800);
          auVar188 = ZEXT3264(local_2840);
          auVar153 = ZEXT3264(local_2860);
          auVar164 = ZEXT3264(local_2880);
          auVar150 = ZEXT3264(local_28a0);
          uVar68 = local_2978;
          uVar66 = local_2a20;
          uVar67 = local_2960;
          pauVar70 = local_2950;
          uVar71 = local_2968;
          uVar72 = local_2970;
          uVar73 = local_29f0;
          ray = pRVar54;
          context = local_2a18;
          uVar76 = local_2980;
          auVar108._0_4_ = local_2820;
          fVar87 = fStack_281c;
          fVar88 = fStack_2818;
          fVar89 = fStack_2814;
          fVar98 = fStack_2810;
          fVar104 = fStack_280c;
          fVar105 = fStack_2808;
        }
      }
      auVar136 = ZEXT3264(local_26e0);
      auVar144 = ZEXT3264(local_2700);
      auVar131 = ZEXT3264(_local_2720);
    }
    fVar1 = (ray->super_RayK<1>).tfar;
    local_2740._4_4_ = fVar1;
    local_2740._0_4_ = fVar1;
    local_2740._8_4_ = fVar1;
    local_2740._12_4_ = fVar1;
    local_2740._16_4_ = fVar1;
    local_2740._20_4_ = fVar1;
    local_2740._24_4_ = fVar1;
    local_2740._28_4_ = fVar1;
    fVar1 = (ray->super_RayK<1>).tfar;
  } while( true );
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }